

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  code *pcVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  long lVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [28];
  undefined1 auVar90 [28];
  byte bVar91;
  uint uVar92;
  ulong uVar93;
  uint uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  long lVar98;
  undefined4 uVar99;
  undefined8 uVar100;
  float fVar114;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar113;
  float fVar115;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar119;
  undefined8 uVar120;
  vint4 bi_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar136;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar124 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar137;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar148 [32];
  undefined1 auVar142 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar158;
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  vint4 ai;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [64];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar190 [16];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined4 uVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar189 [16];
  
  PVar8 = prim[1];
  uVar97 = (ulong)(byte)PVar8;
  lVar74 = uVar97 * 0x19;
  fVar138 = *(float *)(prim + lVar74 + 0x12);
  auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar164 = vsubps_avx(auVar164,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar101._0_4_ = fVar138 * auVar164._0_4_;
  auVar101._4_4_ = fVar138 * auVar164._4_4_;
  auVar101._8_4_ = fVar138 * auVar164._8_4_;
  auVar101._12_4_ = fVar138 * auVar164._12_4_;
  auVar169._0_4_ = fVar138 * auVar13._0_4_;
  auVar169._4_4_ = fVar138 * auVar13._4_4_;
  auVar169._8_4_ = fVar138 * auVar13._8_4_;
  auVar169._12_4_ = fVar138 * auVar13._12_4_;
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar97 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar93 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar97 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar93 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar211._4_4_ = auVar169._0_4_;
  auVar211._0_4_ = auVar169._0_4_;
  auVar211._8_4_ = auVar169._0_4_;
  auVar211._12_4_ = auVar169._0_4_;
  auVar122 = vshufps_avx(auVar169,auVar169,0x55);
  auVar102 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar138 = auVar102._0_4_;
  auVar199._0_4_ = fVar138 * auVar14._0_4_;
  fVar137 = auVar102._4_4_;
  auVar199._4_4_ = fVar137 * auVar14._4_4_;
  fVar113 = auVar102._8_4_;
  auVar199._8_4_ = fVar113 * auVar14._8_4_;
  fVar114 = auVar102._12_4_;
  auVar199._12_4_ = fVar114 * auVar14._12_4_;
  auVar197._0_4_ = auVar17._0_4_ * fVar138;
  auVar197._4_4_ = auVar17._4_4_ * fVar137;
  auVar197._8_4_ = auVar17._8_4_ * fVar113;
  auVar197._12_4_ = auVar17._12_4_ * fVar114;
  auVar184._0_4_ = auVar139._0_4_ * fVar138;
  auVar184._4_4_ = auVar139._4_4_ * fVar137;
  auVar184._8_4_ = auVar139._8_4_ * fVar113;
  auVar184._12_4_ = auVar139._12_4_ * fVar114;
  auVar102 = vfmadd231ps_fma(auVar199,auVar122,auVar13);
  auVar123 = vfmadd231ps_fma(auVar197,auVar122,auVar16);
  auVar122 = vfmadd231ps_fma(auVar184,auVar103,auVar122);
  auVar153 = vfmadd231ps_fma(auVar102,auVar211,auVar164);
  auVar204 = ZEXT1664(auVar153);
  auVar123 = vfmadd231ps_fma(auVar123,auVar211,auVar15);
  auVar160 = vfmadd231ps_fma(auVar122,auVar104,auVar211);
  auVar212._4_4_ = auVar101._0_4_;
  auVar212._0_4_ = auVar101._0_4_;
  auVar212._8_4_ = auVar101._0_4_;
  auVar212._12_4_ = auVar101._0_4_;
  auVar122 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar138 = auVar102._0_4_;
  auVar170._0_4_ = fVar138 * auVar14._0_4_;
  fVar137 = auVar102._4_4_;
  auVar170._4_4_ = fVar137 * auVar14._4_4_;
  fVar113 = auVar102._8_4_;
  auVar170._8_4_ = fVar113 * auVar14._8_4_;
  fVar114 = auVar102._12_4_;
  auVar170._12_4_ = fVar114 * auVar14._12_4_;
  auVar121._0_4_ = auVar17._0_4_ * fVar138;
  auVar121._4_4_ = auVar17._4_4_ * fVar137;
  auVar121._8_4_ = auVar17._8_4_ * fVar113;
  auVar121._12_4_ = auVar17._12_4_ * fVar114;
  auVar102._0_4_ = auVar139._0_4_ * fVar138;
  auVar102._4_4_ = auVar139._4_4_ * fVar137;
  auVar102._8_4_ = auVar139._8_4_ * fVar113;
  auVar102._12_4_ = auVar139._12_4_ * fVar114;
  auVar13 = vfmadd231ps_fma(auVar170,auVar122,auVar13);
  auVar14 = vfmadd231ps_fma(auVar121,auVar122,auVar16);
  auVar16 = vfmadd231ps_fma(auVar102,auVar122,auVar103);
  auVar17 = vfmadd231ps_fma(auVar13,auVar212,auVar164);
  auVar103 = vfmadd231ps_fma(auVar14,auVar212,auVar15);
  auVar139 = vfmadd231ps_fma(auVar16,auVar212,auVar104);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar164 = vandps_avx(auVar153,local_270);
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  auVar164 = vcmpps_avx(auVar164,auVar159,1);
  auVar13 = vblendvps_avx(auVar153,auVar159,auVar164);
  auVar164 = vandps_avx(auVar123,local_270);
  auVar164 = vcmpps_avx(auVar164,auVar159,1);
  auVar14 = vblendvps_avx(auVar123,auVar159,auVar164);
  auVar164 = vandps_avx(auVar160,local_270);
  auVar164 = vcmpps_avx(auVar164,auVar159,1);
  auVar164 = vblendvps_avx(auVar160,auVar159,auVar164);
  auVar15 = vrcpps_avx(auVar13);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = 0x3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar180);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar180);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar164);
  auVar164 = vfnmadd213ps_fma(auVar164,auVar13,auVar180);
  auVar104 = vfmadd132ps_fma(auVar164,auVar13,auVar13);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar164 = vpmovsxwd_avx(auVar164);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar17);
  auVar160._0_4_ = auVar15._0_4_ * auVar164._0_4_;
  auVar160._4_4_ = auVar15._4_4_ * auVar164._4_4_;
  auVar160._8_4_ = auVar15._8_4_ * auVar164._8_4_;
  auVar160._12_4_ = auVar15._12_4_ * auVar164._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar164 = vpmovsxwd_avx(auVar13);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar17);
  auVar171._0_4_ = auVar15._0_4_ * auVar164._0_4_;
  auVar171._4_4_ = auVar15._4_4_ * auVar164._4_4_;
  auVar171._8_4_ = auVar15._8_4_ * auVar164._8_4_;
  auVar171._12_4_ = auVar15._12_4_ * auVar164._12_4_;
  auVar123._1_3_ = 0;
  auVar123[0] = PVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar97 * -2 + 6);
  auVar164 = vpmovsxwd_avx(auVar15);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar103);
  auVar185._0_4_ = auVar164._0_4_ * auVar16._0_4_;
  auVar185._4_4_ = auVar164._4_4_ * auVar16._4_4_;
  auVar185._8_4_ = auVar164._8_4_ * auVar16._8_4_;
  auVar185._12_4_ = auVar164._12_4_ * auVar16._12_4_;
  auVar164 = vcvtdq2ps_avx(auVar13);
  auVar164 = vsubps_avx(auVar164,auVar103);
  auVar122._0_4_ = auVar16._0_4_ * auVar164._0_4_;
  auVar122._4_4_ = auVar16._4_4_ * auVar164._4_4_;
  auVar122._8_4_ = auVar16._8_4_ * auVar164._8_4_;
  auVar122._12_4_ = auVar16._12_4_ * auVar164._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar93 + uVar97 + 6);
  auVar164 = vpmovsxwd_avx(auVar16);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar139);
  auVar153._0_4_ = auVar104._0_4_ * auVar164._0_4_;
  auVar153._4_4_ = auVar104._4_4_ * auVar164._4_4_;
  auVar153._8_4_ = auVar104._8_4_ * auVar164._8_4_;
  auVar153._12_4_ = auVar104._12_4_ * auVar164._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar164 = vpmovsxwd_avx(auVar17);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar139);
  auVar103._0_4_ = auVar104._0_4_ * auVar164._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar164._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar164._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar164._12_4_;
  auVar164 = vpminsd_avx(auVar160,auVar171);
  auVar13 = vpminsd_avx(auVar185,auVar122);
  auVar164 = vmaxps_avx(auVar164,auVar13);
  auVar13 = vpminsd_avx(auVar153,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar189._4_4_ = uVar99;
  auVar189._0_4_ = uVar99;
  auVar189._8_4_ = uVar99;
  auVar189._12_4_ = uVar99;
  auVar196 = ZEXT1664(auVar189);
  auVar13 = vmaxps_avx(auVar13,auVar189);
  auVar164 = vmaxps_avx(auVar164,auVar13);
  local_280._0_4_ = auVar164._0_4_ * 0.99999964;
  local_280._4_4_ = auVar164._4_4_ * 0.99999964;
  local_280._8_4_ = auVar164._8_4_ * 0.99999964;
  local_280._12_4_ = auVar164._12_4_ * 0.99999964;
  auVar164 = vpmaxsd_avx(auVar160,auVar171);
  auVar13 = vpmaxsd_avx(auVar185,auVar122);
  auVar164 = vminps_avx(auVar164,auVar13);
  auVar13 = vpmaxsd_avx(auVar153,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar139._4_4_ = uVar99;
  auVar139._0_4_ = uVar99;
  auVar139._8_4_ = uVar99;
  auVar139._12_4_ = uVar99;
  auVar13 = vminps_avx(auVar13,auVar139);
  auVar164 = vminps_avx(auVar164,auVar13);
  auVar104._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar123[4] = PVar8;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar8;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar8;
  auVar123._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar123,_DAT_01f7fcf0);
  auVar164 = vcmpps_avx(local_280,auVar104,2);
  auVar164 = vandps_avx(auVar164,auVar13);
  uVar94 = vmovmskps_avx(auVar164);
  if (uVar94 == 0) {
    bVar91 = 0;
  }
  else {
    uVar94 = uVar94 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    do {
      auVar133 = local_460;
      auVar201 = auVar204._0_32_;
      lVar21 = 0;
      uVar97 = (ulong)uVar94;
      for (uVar93 = uVar97; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar97 = uVar97 - 1 & uVar97;
      local_570 = *(undefined4 *)(prim + lVar21 * 4 + 6);
      uVar93 = (ulong)(uint)((int)lVar21 << 6);
      uVar94 = *(uint *)(prim + 2);
      local_728 = (ulong)uVar94;
      pGVar10 = (context->scene->geometries).items[local_728].ptr;
      pPVar1 = prim + uVar93 + lVar74 + 0x16;
      local_680 = *(undefined8 *)pPVar1;
      uStack_678 = *(undefined8 *)(pPVar1 + 8);
      if (uVar97 != 0) {
        uVar95 = uVar97 - 1 & uVar97;
        for (uVar96 = uVar97; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        }
        if (uVar95 != 0) {
          for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_660 = *(undefined1 (*) [16])(prim + uVar93 + lVar74 + 0x26);
      local_670 = *(undefined1 (*) [16])(prim + uVar93 + lVar74 + 0x36);
      _local_530 = *(undefined1 (*) [16])(prim + uVar93 + lVar74 + 0x46);
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar15 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar13 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar15);
      uVar99 = auVar13._0_4_;
      auVar161._4_4_ = uVar99;
      auVar161._0_4_ = uVar99;
      auVar161._8_4_ = uVar99;
      auVar161._12_4_ = uVar99;
      auVar164 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar138 = pre->ray_space[k].vz.field_0.m128[0];
      fVar137 = pre->ray_space[k].vz.field_0.m128[1];
      fVar113 = pre->ray_space[k].vz.field_0.m128[2];
      fVar114 = pre->ray_space[k].vz.field_0.m128[3];
      auVar175._0_4_ = fVar138 * auVar13._0_4_;
      auVar175._4_4_ = fVar137 * auVar13._4_4_;
      auVar175._8_4_ = fVar113 * auVar13._8_4_;
      auVar175._12_4_ = fVar114 * auVar13._12_4_;
      auVar164 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar6,auVar164);
      auVar17 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar161);
      auVar164 = vblendps_avx(auVar17,*(undefined1 (*) [16])pPVar1,8);
      auVar14 = vsubps_avx(local_660,auVar15);
      uVar99 = auVar14._0_4_;
      auVar176._4_4_ = uVar99;
      auVar176._0_4_ = uVar99;
      auVar176._8_4_ = uVar99;
      auVar176._12_4_ = uVar99;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar190._0_4_ = fVar138 * auVar14._0_4_;
      auVar190._4_4_ = fVar137 * auVar14._4_4_;
      auVar190._8_4_ = fVar113 * auVar14._8_4_;
      auVar190._12_4_ = fVar114 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar6,auVar13);
      auVar104 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar176);
      auVar13 = vblendps_avx(auVar104,local_660,8);
      auVar16 = vsubps_avx(local_670,auVar15);
      uVar99 = auVar16._0_4_;
      auVar181._4_4_ = uVar99;
      auVar181._0_4_ = uVar99;
      auVar181._8_4_ = uVar99;
      auVar181._12_4_ = uVar99;
      auVar14 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar200._0_4_ = fVar138 * auVar16._0_4_;
      auVar200._4_4_ = fVar137 * auVar16._4_4_;
      auVar200._8_4_ = fVar113 * auVar16._8_4_;
      auVar200._12_4_ = fVar114 * auVar16._12_4_;
      auVar14 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar14);
      auVar103 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar181);
      auVar14 = vblendps_avx(auVar103,local_670,8);
      auVar16 = vsubps_avx(_local_530,auVar15);
      uVar99 = auVar16._0_4_;
      auVar182._4_4_ = uVar99;
      auVar182._0_4_ = uVar99;
      auVar182._8_4_ = uVar99;
      auVar182._12_4_ = uVar99;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar205._0_4_ = fVar138 * auVar16._0_4_;
      auVar205._4_4_ = fVar137 * auVar16._4_4_;
      auVar205._8_4_ = fVar113 * auVar16._8_4_;
      auVar205._12_4_ = fVar114 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar15);
      auVar139 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar182);
      auVar15 = vblendps_avx(auVar139,_local_530,8);
      auVar164 = vandps_avx(auVar164,local_270);
      auVar13 = vandps_avx(auVar13,local_270);
      auVar16 = vmaxps_avx(auVar164,auVar13);
      auVar164 = vandps_avx(auVar14,local_270);
      auVar13 = vandps_avx(auVar15,local_270);
      auVar164 = vmaxps_avx(auVar164,auVar13);
      auVar164 = vmaxps_avx(auVar16,auVar164);
      auVar13 = vmovshdup_avx(auVar164);
      auVar13 = vmaxss_avx(auVar13,auVar164);
      auVar164 = vshufpd_avx(auVar164,auVar164,1);
      auVar164 = vmaxss_avx(auVar164,auVar13);
      lVar21 = (long)iVar9 * 0x44;
      auVar13 = vmovshdup_avx(auVar17);
      uVar100 = auVar13._0_8_;
      local_4e0._8_8_ = uVar100;
      local_4e0._0_8_ = uVar100;
      local_4e0._16_8_ = uVar100;
      local_4e0._24_8_ = uVar100;
      auVar13 = vmovshdup_avx(auVar104);
      uVar100 = auVar13._0_8_;
      auVar215._8_8_ = uVar100;
      auVar215._0_8_ = uVar100;
      auVar215._16_8_ = uVar100;
      auVar215._24_8_ = uVar100;
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar198 = auVar103._0_4_;
      auVar146._4_4_ = uVar198;
      auVar146._0_4_ = uVar198;
      auVar146._8_4_ = uVar198;
      auVar146._12_4_ = uVar198;
      auVar146._16_4_ = uVar198;
      auVar146._20_4_ = uVar198;
      auVar146._24_4_ = uVar198;
      auVar146._28_4_ = uVar198;
      auVar13 = vmovshdup_avx(auVar103);
      uVar100 = auVar13._0_8_;
      auVar202._8_8_ = uVar100;
      auVar202._0_8_ = uVar100;
      auVar202._16_8_ = uVar100;
      auVar202._24_8_ = uVar100;
      pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar21 + 0xd8c);
      auVar89 = *(undefined1 (*) [28])*pauVar2;
      local_6a0 = auVar139._0_4_;
      auVar13 = vmovshdup_avx(auVar139);
      uVar100 = auVar13._0_8_;
      auVar150._4_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar150._0_4_ = local_6a0 * *(float *)*pauVar2;
      auVar150._8_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar150._12_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar150._16_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar150._20_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar150._24_4_ = local_6a0 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar150._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar14 = vfmadd231ps_fma(auVar150,auVar112,auVar146);
      fVar152 = auVar13._0_4_;
      auVar210._0_4_ = fVar152 * *(float *)*pauVar2;
      fVar158 = auVar13._4_4_;
      auVar210._4_4_ = fVar158 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar210._8_4_ = fVar152 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar210._12_4_ = fVar158 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar210._16_4_ = fVar152 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar210._20_4_ = fVar158 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar210._24_4_ = fVar152 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar210._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar210,auVar112,auVar202);
      auVar150 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar99 = auVar104._0_4_;
      local_6c0._4_4_ = uVar99;
      local_6c0._0_4_ = uVar99;
      local_6c0._8_4_ = uVar99;
      local_6c0._12_4_ = uVar99;
      local_6c0._16_4_ = uVar99;
      local_6c0._20_4_ = uVar99;
      local_6c0._24_4_ = uVar99;
      local_6c0._28_4_ = uVar99;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,local_6c0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar150,auVar215);
      auVar210 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      local_4a0._0_4_ = auVar17._0_4_;
      local_6e0._4_4_ = local_4a0._0_4_;
      local_6e0._0_4_ = local_4a0._0_4_;
      local_6e0._8_4_ = local_4a0._0_4_;
      local_6e0._12_4_ = local_4a0._0_4_;
      local_6e0._16_4_ = local_4a0._0_4_;
      local_6e0._20_4_ = local_4a0._0_4_;
      local_6e0._24_4_ = local_4a0._0_4_;
      local_6e0._28_4_ = local_4a0._0_4_;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar210,local_6e0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar210,local_4e0);
      local_340 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar118 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar75 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar76 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar77 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar78 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar79 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar80 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      auVar7._4_4_ = fVar75 * local_6a0;
      auVar7._0_4_ = fVar118 * local_6a0;
      auVar7._8_4_ = fVar76 * local_6a0;
      auVar7._12_4_ = fVar77 * local_6a0;
      auVar7._16_4_ = fVar78 * local_6a0;
      auVar7._20_4_ = fVar79 * local_6a0;
      auVar7._24_4_ = fVar80 * local_6a0;
      auVar7._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar14 = vfmadd231ps_fma(auVar7,local_340,auVar146);
      auVar195._4_4_ = fVar75 * fVar158;
      auVar195._0_4_ = fVar118 * fVar152;
      auVar195._8_4_ = fVar76 * fVar152;
      auVar195._12_4_ = fVar77 * fVar158;
      auVar195._16_4_ = fVar78 * fVar152;
      auVar195._20_4_ = fVar79 * fVar158;
      auVar195._24_4_ = fVar80 * fVar152;
      auVar195._28_4_ = uVar198;
      auVar16 = vfmadd231ps_fma(auVar195,local_340,auVar202);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,local_6c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,auVar215);
      local_600 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_600,local_6e0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_600,local_4e0);
      local_2c0 = ZEXT1632(auVar14);
      auVar126 = ZEXT1632(auVar15);
      auVar186 = vsubps_avx(local_2c0,auVar126);
      local_2e0 = ZEXT1632(auVar16);
      _local_300 = ZEXT1632(auVar13);
      _local_320 = vsubps_avx(local_2e0,_local_300);
      auVar106._0_4_ = auVar13._0_4_ * auVar186._0_4_;
      auVar106._4_4_ = auVar13._4_4_ * auVar186._4_4_;
      auVar106._8_4_ = auVar13._8_4_ * auVar186._8_4_;
      auVar106._12_4_ = auVar13._12_4_ * auVar186._12_4_;
      auVar106._16_4_ = auVar186._16_4_ * 0.0;
      auVar106._20_4_ = auVar186._20_4_ * 0.0;
      auVar106._24_4_ = auVar186._24_4_ * 0.0;
      auVar106._28_4_ = 0;
      fVar138 = local_320._0_4_;
      auVar127._0_4_ = auVar15._0_4_ * fVar138;
      fVar137 = local_320._4_4_;
      auVar127._4_4_ = auVar15._4_4_ * fVar137;
      fVar113 = local_320._8_4_;
      auVar127._8_4_ = auVar15._8_4_ * fVar113;
      fVar114 = local_320._12_4_;
      auVar127._12_4_ = auVar15._12_4_ * fVar114;
      fVar115 = local_320._16_4_;
      auVar127._16_4_ = fVar115 * 0.0;
      fVar116 = local_320._20_4_;
      auVar127._20_4_ = fVar116 * 0.0;
      fVar117 = local_320._24_4_;
      auVar127._24_4_ = fVar117 * 0.0;
      auVar127._28_4_ = 0;
      auVar106 = vsubps_avx(auVar106,auVar127);
      auVar13 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar120 = auVar13._0_8_;
      local_80._8_8_ = uVar120;
      local_80._0_8_ = uVar120;
      local_80._16_8_ = uVar120;
      local_80._24_8_ = uVar120;
      auVar14 = vpermilps_avx(local_660,0xff);
      uVar120 = auVar14._0_8_;
      local_a0._8_8_ = uVar120;
      local_a0._0_8_ = uVar120;
      local_a0._16_8_ = uVar120;
      local_a0._24_8_ = uVar120;
      auVar14 = vpermilps_avx(local_670,0xff);
      uVar120 = auVar14._0_8_;
      local_c0._8_8_ = uVar120;
      local_c0._0_8_ = uVar120;
      local_c0._16_8_ = uVar120;
      local_c0._24_8_ = uVar120;
      auVar14 = vpermilps_avx(_local_530,0xff);
      local_e0 = auVar14._0_8_;
      local_700._0_4_ = auVar89._0_4_;
      local_700._4_4_ = auVar89._4_4_;
      fStack_6f8 = auVar89._8_4_;
      fStack_6f4 = auVar89._12_4_;
      auStack_6f0._0_4_ = auVar89._16_4_;
      auStack_6f0._4_4_ = auVar89._20_4_;
      fStack_6e8 = auVar89._24_4_;
      fVar119 = auVar14._0_4_;
      fVar136 = auVar14._4_4_;
      auVar20._4_4_ = fVar136 * (float)local_700._4_4_;
      auVar20._0_4_ = fVar119 * (float)local_700._0_4_;
      auVar20._8_4_ = fVar119 * fStack_6f8;
      auVar20._12_4_ = fVar136 * fStack_6f4;
      auVar20._16_4_ = fVar119 * (float)auStack_6f0._0_4_;
      auVar20._20_4_ = fVar136 * (float)auStack_6f0._4_4_;
      auVar20._24_4_ = fVar119 * fStack_6e8;
      auVar20._28_4_ = local_4a0._0_4_;
      auVar14 = vfmadd231ps_fma(auVar20,local_c0,auVar112);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar210,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar149._4_4_ = fVar75 * fVar136;
      auVar149._0_4_ = fVar118 * fVar119;
      auVar149._8_4_ = fVar76 * fVar119;
      auVar149._12_4_ = fVar77 * fVar136;
      auVar149._16_4_ = fVar78 * fVar119;
      auVar149._20_4_ = fVar79 * fVar136;
      auVar149._24_4_ = fVar80 * fVar119;
      auVar149._28_4_ = auVar210._28_4_;
      auVar16 = vfmadd231ps_fma(auVar149,local_340,local_c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_600,local_80);
      auVar191._4_4_ = fVar137 * fVar137;
      auVar191._0_4_ = fVar138 * fVar138;
      auVar191._8_4_ = fVar113 * fVar113;
      auVar191._12_4_ = fVar114 * fVar114;
      auVar191._16_4_ = fVar115 * fVar115;
      auVar191._20_4_ = fVar116 * fVar116;
      auVar191._24_4_ = fVar117 * fVar117;
      auVar191._28_4_ = auVar13._4_4_;
      auVar13 = vfmadd231ps_fma(auVar191,auVar186,auVar186);
      auVar195 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar16));
      auVar18._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar13._4_4_;
      auVar18._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar13._0_4_;
      auVar18._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar13._8_4_;
      auVar18._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar13._12_4_;
      auVar18._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
      auVar18._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
      auVar18._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
      auVar18._28_4_ = auVar195._28_4_;
      auVar19._4_4_ = auVar106._4_4_ * auVar106._4_4_;
      auVar19._0_4_ = auVar106._0_4_ * auVar106._0_4_;
      auVar19._8_4_ = auVar106._8_4_ * auVar106._8_4_;
      auVar19._12_4_ = auVar106._12_4_ * auVar106._12_4_;
      auVar19._16_4_ = auVar106._16_4_ * auVar106._16_4_;
      auVar19._20_4_ = auVar106._20_4_ * auVar106._20_4_;
      auVar19._24_4_ = auVar106._24_4_ * auVar106._24_4_;
      auVar19._28_4_ = auVar106._28_4_;
      auVar195 = vcmpps_avx(auVar19,auVar18,2);
      fVar138 = auVar164._0_4_ * 4.7683716e-07;
      auVar107._0_4_ = (float)iVar9;
      local_460._4_12_ = auVar139._4_12_;
      local_460._0_4_ = auVar107._0_4_;
      local_460._16_16_ = auVar133._16_16_;
      auVar107._4_4_ = auVar107._0_4_;
      auVar107._8_4_ = auVar107._0_4_;
      auVar107._12_4_ = auVar107._0_4_;
      auVar107._16_4_ = auVar107._0_4_;
      auVar107._20_4_ = auVar107._0_4_;
      auVar107._24_4_ = auVar107._0_4_;
      auVar107._28_4_ = auVar107._0_4_;
      auVar133 = vcmpps_avx(_DAT_01faff40,auVar107,1);
      auVar13 = vpermilps_avx(auVar17,0xaa);
      uVar120 = auVar13._0_8_;
      auVar154._8_8_ = uVar120;
      auVar154._0_8_ = uVar120;
      auVar154._16_8_ = uVar120;
      auVar154._24_8_ = uVar120;
      auVar164 = vpermilps_avx(auVar104,0xaa);
      uVar120 = auVar164._0_8_;
      local_100._8_8_ = uVar120;
      local_100._0_8_ = uVar120;
      local_100._16_8_ = uVar120;
      local_100._24_8_ = uVar120;
      auVar164 = vpermilps_avx(auVar103,0xaa);
      uVar120 = auVar164._0_8_;
      local_4a0._8_8_ = uVar120;
      local_4a0._0_8_ = uVar120;
      local_4a0._16_8_ = uVar120;
      local_4a0._24_8_ = uVar120;
      auVar164 = vshufps_avx(auVar139,auVar139,0xaa);
      uVar120 = auVar164._0_8_;
      register0x00001508 = uVar120;
      local_620 = uVar120;
      register0x00001510 = uVar120;
      register0x00001518 = uVar120;
      auVar106 = auVar133 & auVar195;
      uVar92 = *(uint *)(ray + k * 4 + 0x30);
      local_560._0_16_ = ZEXT416(uVar92);
      fStack_69c = local_6a0;
      fStack_698 = local_6a0;
      fStack_694 = local_6a0;
      fStack_690 = local_6a0;
      fStack_68c = local_6a0;
      fStack_688 = local_6a0;
      fStack_684 = local_6a0;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        auVar204 = ZEXT3264(auVar201);
LAB_015c6e0d:
        auVar183 = ZEXT3264(CONCAT428(local_6a0,
                                      CONCAT424(local_6a0,
                                                CONCAT420(local_6a0,
                                                          CONCAT416(local_6a0,
                                                                    CONCAT412(local_6a0,
                                                                              CONCAT48(local_6a0,
                                                                                       CONCAT44(
                                                  local_6a0,local_6a0))))))));
        auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,CONCAT416(fVar152,
                                                  CONCAT412(fVar158,CONCAT48(fVar152,uVar100)))))));
LAB_015c6e28:
        auVar209 = ZEXT3264(_local_620);
        auVar188 = ZEXT3264(local_6c0);
        uVar93 = 0;
        auVar157 = ZEXT3264(local_6e0);
      }
      else {
        local_500 = SUB84(pGVar10,0);
        uStack_4fc = (undefined4)((ulong)pGVar10 >> 0x20);
        _local_360 = vandps_avx(auVar195,auVar133);
        fVar119 = auVar164._0_4_;
        fVar136 = auVar164._4_4_;
        auVar133._4_4_ = fVar136 * fVar75;
        auVar133._0_4_ = fVar119 * fVar118;
        auVar133._8_4_ = fVar119 * fVar76;
        auVar133._12_4_ = fVar136 * fVar77;
        auVar133._16_4_ = fVar119 * fVar78;
        auVar133._20_4_ = fVar136 * fVar79;
        auVar133._24_4_ = fVar119 * fVar80;
        auVar133._28_4_ = local_360._28_4_;
        auVar164 = vfmadd213ps_fma(local_340,local_4a0,auVar133);
        auVar164 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar164));
        auVar164 = vfmadd213ps_fma(local_600,auVar154,ZEXT1632(auVar164));
        local_600 = ZEXT1632(auVar164);
        auVar108._0_4_ = fVar119 * (float)local_700._0_4_;
        auVar108._4_4_ = fVar136 * (float)local_700._4_4_;
        auVar108._8_4_ = fVar119 * fStack_6f8;
        auVar108._12_4_ = fVar136 * fStack_6f4;
        auVar108._16_4_ = fVar119 * (float)auStack_6f0._0_4_;
        auVar108._20_4_ = fVar136 * (float)auStack_6f0._4_4_;
        auVar108._24_4_ = fVar119 * fStack_6e8;
        auVar108._28_4_ = 0;
        auVar164 = vfmadd213ps_fma(auVar112,local_4a0,auVar108);
        auVar164 = vfmadd213ps_fma(auVar150,local_100,ZEXT1632(auVar164));
        auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar150 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        fVar137 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar113 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar114 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar115 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar116 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar117 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar118 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        auVar213._4_4_ = local_6a0 * fVar113;
        auVar213._0_4_ = local_6a0 * fVar137;
        auVar213._8_4_ = local_6a0 * fVar114;
        auVar213._12_4_ = local_6a0 * fVar115;
        auVar213._16_4_ = local_6a0 * fVar116;
        auVar213._20_4_ = local_6a0 * fVar117;
        auVar213._24_4_ = local_6a0 * fVar118;
        auVar213._28_4_ = local_320._28_4_;
        auVar23._4_4_ = fVar158 * fVar113;
        auVar23._0_4_ = fVar152 * fVar137;
        auVar23._8_4_ = fVar152 * fVar114;
        auVar23._12_4_ = fVar158 * fVar115;
        auVar23._16_4_ = fVar152 * fVar116;
        auVar23._20_4_ = fVar158 * fVar117;
        auVar23._24_4_ = fVar152 * fVar118;
        auVar23._28_4_ = *(undefined4 *)(bspline_basis1 + lVar21 + 0xda8);
        auVar24._4_4_ = fVar136 * fVar113;
        auVar24._0_4_ = fVar119 * fVar137;
        auVar24._8_4_ = fVar119 * fVar114;
        auVar24._12_4_ = fVar136 * fVar115;
        auVar24._16_4_ = fVar119 * fVar116;
        auVar24._20_4_ = fVar136 * fVar117;
        auVar24._24_4_ = fVar119 * fVar118;
        auVar24._28_4_ = auVar186._28_4_;
        auVar17 = vfmadd231ps_fma(auVar213,auVar150,auVar146);
        auVar104 = vfmadd231ps_fma(auVar23,auVar150,auVar202);
        auVar103 = vfmadd231ps_fma(auVar24,local_4a0,auVar150);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,local_6c0);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar112,auVar215);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_100,auVar112);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar133,local_6e0);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar133,local_4e0);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar154,auVar133);
        fVar137 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar113 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar114 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar115 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar116 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar117 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar118 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar112._4_4_ = local_6a0 * fVar113;
        auVar112._0_4_ = local_6a0 * fVar137;
        auVar112._8_4_ = local_6a0 * fVar114;
        auVar112._12_4_ = local_6a0 * fVar115;
        auVar112._16_4_ = local_6a0 * fVar116;
        auVar112._20_4_ = local_6a0 * fVar117;
        auVar112._24_4_ = local_6a0 * fVar118;
        auVar112._28_4_ = local_6a0;
        auVar25._4_4_ = fVar158 * fVar113;
        auVar25._0_4_ = fVar152 * fVar137;
        auVar25._8_4_ = fVar152 * fVar114;
        auVar25._12_4_ = fVar158 * fVar115;
        auVar25._16_4_ = fVar152 * fVar116;
        auVar25._20_4_ = fVar158 * fVar117;
        auVar25._24_4_ = fVar152 * fVar118;
        auVar25._28_4_ = fVar158;
        auVar26._4_4_ = fVar113 * fVar136;
        auVar26._0_4_ = fVar137 * fVar119;
        auVar26._8_4_ = fVar114 * fVar119;
        auVar26._12_4_ = fVar115 * fVar136;
        auVar26._16_4_ = fVar116 * fVar119;
        auVar26._20_4_ = fVar117 * fVar136;
        auVar26._24_4_ = fVar118 * fVar119;
        auVar26._28_4_ = auVar13._4_4_;
        auVar133 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar13 = vfmadd231ps_fma(auVar112,auVar133,auVar146);
        auVar139 = vfmadd231ps_fma(auVar25,auVar133,auVar202);
        auVar122 = vfmadd231ps_fma(auVar26,auVar133,local_4a0);
        auVar133 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_6c0);
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar133,auVar215);
        auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),local_100,auVar133);
        auVar133 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_6e0);
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar133,local_4e0);
        auVar128._8_4_ = 0x7fffffff;
        auVar128._0_8_ = 0x7fffffff7fffffff;
        auVar128._12_4_ = 0x7fffffff;
        auVar128._16_4_ = 0x7fffffff;
        auVar128._20_4_ = 0x7fffffff;
        auVar128._24_4_ = 0x7fffffff;
        auVar128._28_4_ = 0x7fffffff;
        auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar154,auVar133);
        auVar133 = vandps_avx(ZEXT1632(auVar17),auVar128);
        auVar112 = vandps_avx(ZEXT1632(auVar104),auVar128);
        auVar112 = vmaxps_avx(auVar133,auVar112);
        auVar133 = vandps_avx(ZEXT1632(auVar103),auVar128);
        auVar133 = vmaxps_avx(auVar112,auVar133);
        auVar147._4_4_ = fVar138;
        auVar147._0_4_ = fVar138;
        auVar147._8_4_ = fVar138;
        auVar147._12_4_ = fVar138;
        auVar147._16_4_ = fVar138;
        auVar147._20_4_ = fVar138;
        auVar147._24_4_ = fVar138;
        auVar147._28_4_ = fVar138;
        auVar133 = vcmpps_avx(auVar133,auVar147,1);
        auVar150 = vblendvps_avx(ZEXT1632(auVar17),auVar186,auVar133);
        auVar7 = vblendvps_avx(ZEXT1632(auVar104),_local_320,auVar133);
        auVar133 = vandps_avx(ZEXT1632(auVar13),auVar128);
        auVar112 = vandps_avx(ZEXT1632(auVar139),auVar128);
        auVar195 = vmaxps_avx(auVar133,auVar112);
        auVar133 = vandps_avx(ZEXT1632(auVar122),auVar128);
        auVar133 = vmaxps_avx(auVar195,auVar133);
        auVar106 = vcmpps_avx(auVar133,auVar147,1);
        auVar133 = vblendvps_avx(ZEXT1632(auVar13),auVar186,auVar106);
        auVar195 = vblendvps_avx(ZEXT1632(auVar139),_local_320,auVar106);
        auVar164 = vfmadd213ps_fma(auVar210,auVar154,ZEXT1632(auVar164));
        auVar13 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar7,auVar7);
        auVar210 = vrsqrtps_avx(ZEXT1632(auVar13));
        fVar137 = auVar210._0_4_;
        fVar113 = auVar210._4_4_;
        fVar114 = auVar210._8_4_;
        fVar115 = auVar210._12_4_;
        fVar116 = auVar210._16_4_;
        fVar117 = auVar210._20_4_;
        fVar118 = auVar210._24_4_;
        auVar186._4_4_ = fVar113 * fVar113 * fVar113 * auVar13._4_4_ * -0.5;
        auVar186._0_4_ = fVar137 * fVar137 * fVar137 * auVar13._0_4_ * -0.5;
        auVar186._8_4_ = fVar114 * fVar114 * fVar114 * auVar13._8_4_ * -0.5;
        auVar186._12_4_ = fVar115 * fVar115 * fVar115 * auVar13._12_4_ * -0.5;
        auVar186._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar186._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar186._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar186._28_4_ = 0;
        auVar167._8_4_ = 0x3fc00000;
        auVar167._0_8_ = 0x3fc000003fc00000;
        auVar167._12_4_ = 0x3fc00000;
        auVar167._16_4_ = 0x3fc00000;
        auVar167._20_4_ = 0x3fc00000;
        auVar167._24_4_ = 0x3fc00000;
        auVar167._28_4_ = 0x3fc00000;
        auVar13 = vfmadd231ps_fma(auVar186,auVar167,auVar210);
        fVar137 = auVar13._0_4_;
        fVar113 = auVar13._4_4_;
        auVar27._4_4_ = auVar7._4_4_ * fVar113;
        auVar27._0_4_ = auVar7._0_4_ * fVar137;
        fVar114 = auVar13._8_4_;
        auVar27._8_4_ = auVar7._8_4_ * fVar114;
        fVar115 = auVar13._12_4_;
        auVar27._12_4_ = auVar7._12_4_ * fVar115;
        auVar27._16_4_ = auVar7._16_4_ * 0.0;
        auVar27._20_4_ = auVar7._20_4_ * 0.0;
        auVar27._24_4_ = auVar7._24_4_ * 0.0;
        auVar27._28_4_ = auVar210._28_4_;
        auVar28._4_4_ = -auVar150._4_4_ * fVar113;
        auVar28._0_4_ = -auVar150._0_4_ * fVar137;
        auVar28._8_4_ = -auVar150._8_4_ * fVar114;
        auVar28._12_4_ = -auVar150._12_4_ * fVar115;
        auVar28._16_4_ = -auVar150._16_4_ * 0.0;
        auVar28._20_4_ = -auVar150._20_4_ * 0.0;
        auVar28._24_4_ = -auVar150._24_4_ * 0.0;
        auVar28._28_4_ = auVar112._28_4_;
        auVar13 = vfmadd213ps_fma(auVar133,auVar133,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar195,auVar195);
        auVar112 = vrsqrtps_avx(ZEXT1632(auVar13));
        auVar29._28_4_ = auVar106._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar115 * 0.0,
                                CONCAT48(fVar114 * 0.0,CONCAT44(fVar113 * 0.0,fVar137 * 0.0))));
        fVar137 = auVar112._0_4_;
        fVar113 = auVar112._4_4_;
        fVar114 = auVar112._8_4_;
        fVar115 = auVar112._12_4_;
        fVar116 = auVar112._16_4_;
        fVar117 = auVar112._20_4_;
        fVar118 = auVar112._24_4_;
        auVar30._4_4_ = fVar113 * fVar113 * fVar113 * auVar13._4_4_ * -0.5;
        auVar30._0_4_ = fVar137 * fVar137 * fVar137 * auVar13._0_4_ * -0.5;
        auVar30._8_4_ = fVar114 * fVar114 * fVar114 * auVar13._8_4_ * -0.5;
        auVar30._12_4_ = fVar115 * fVar115 * fVar115 * auVar13._12_4_ * -0.5;
        auVar30._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar30._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar30._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
        auVar30._28_4_ = 0;
        auVar13 = vfmadd231ps_fma(auVar30,auVar167,auVar112);
        fVar137 = auVar13._0_4_;
        fVar113 = auVar13._4_4_;
        auVar31._4_4_ = auVar195._4_4_ * fVar113;
        auVar31._0_4_ = auVar195._0_4_ * fVar137;
        fVar114 = auVar13._8_4_;
        auVar31._8_4_ = auVar195._8_4_ * fVar114;
        fVar115 = auVar13._12_4_;
        auVar31._12_4_ = auVar195._12_4_ * fVar115;
        auVar31._16_4_ = auVar195._16_4_ * 0.0;
        auVar31._20_4_ = auVar195._20_4_ * 0.0;
        auVar31._24_4_ = auVar195._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = -auVar133._4_4_ * fVar113;
        auVar32._0_4_ = -auVar133._0_4_ * fVar137;
        auVar32._8_4_ = -auVar133._8_4_ * fVar114;
        auVar32._12_4_ = -auVar133._12_4_ * fVar115;
        auVar32._16_4_ = -auVar133._16_4_ * 0.0;
        auVar32._20_4_ = -auVar133._20_4_ * 0.0;
        auVar32._24_4_ = -auVar133._24_4_ * 0.0;
        auVar32._28_4_ = auVar195._28_4_;
        auVar33._28_4_ = auVar112._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar115 * 0.0,
                                CONCAT48(fVar114 * 0.0,CONCAT44(fVar113 * 0.0,fVar137 * 0.0))));
        auVar13 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar14),auVar126);
        auVar133 = ZEXT1632(auVar14);
        auVar17 = vfmadd213ps_fma(auVar28,auVar133,_local_300);
        auVar104 = vfmadd213ps_fma(auVar29,auVar133,ZEXT1632(auVar164));
        auVar102 = vfnmadd213ps_fma(auVar27,auVar133,auVar126);
        auVar103 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar16),local_2c0);
        auVar123 = vfnmadd213ps_fma(auVar28,auVar133,_local_300);
        auVar133 = ZEXT1632(auVar16);
        auVar139 = vfmadd213ps_fma(auVar32,auVar133,local_2e0);
        auVar213 = ZEXT1632(auVar14);
        auVar101 = vfnmadd231ps_fma(ZEXT1632(auVar164),auVar213,auVar29);
        auVar14 = vfmadd213ps_fma(auVar33,auVar133,local_600);
        auVar153 = vfnmadd213ps_fma(auVar31,auVar133,local_2c0);
        auVar160 = vfnmadd213ps_fma(auVar32,auVar133,local_2e0);
        auVar121 = vfnmadd231ps_fma(local_600,ZEXT1632(auVar16),auVar33);
        auVar133 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar123));
        auVar112 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar101));
        auVar126._4_4_ = auVar101._4_4_ * auVar133._4_4_;
        auVar126._0_4_ = auVar101._0_4_ * auVar133._0_4_;
        auVar126._8_4_ = auVar101._8_4_ * auVar133._8_4_;
        auVar126._12_4_ = auVar101._12_4_ * auVar133._12_4_;
        auVar126._16_4_ = auVar133._16_4_ * 0.0;
        auVar126._20_4_ = auVar133._20_4_ * 0.0;
        auVar126._24_4_ = auVar133._24_4_ * 0.0;
        auVar126._28_4_ = 0;
        auVar122 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar123),auVar112);
        auVar34._4_4_ = auVar102._4_4_ * auVar112._4_4_;
        auVar34._0_4_ = auVar102._0_4_ * auVar112._0_4_;
        auVar34._8_4_ = auVar102._8_4_ * auVar112._8_4_;
        auVar34._12_4_ = auVar102._12_4_ * auVar112._12_4_;
        auVar34._16_4_ = auVar112._16_4_ * 0.0;
        auVar34._20_4_ = auVar112._20_4_ * 0.0;
        auVar34._24_4_ = auVar112._24_4_ * 0.0;
        auVar34._28_4_ = auVar112._28_4_;
        auVar186 = ZEXT1632(auVar102);
        auVar112 = vsubps_avx(ZEXT1632(auVar103),auVar186);
        auVar164 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar101),auVar112);
        auVar35._4_4_ = auVar123._4_4_ * auVar112._4_4_;
        auVar35._0_4_ = auVar123._0_4_ * auVar112._0_4_;
        auVar35._8_4_ = auVar123._8_4_ * auVar112._8_4_;
        auVar35._12_4_ = auVar123._12_4_ * auVar112._12_4_;
        auVar35._16_4_ = auVar112._16_4_ * 0.0;
        auVar35._20_4_ = auVar112._20_4_ * 0.0;
        auVar35._24_4_ = auVar112._24_4_ * 0.0;
        auVar35._28_4_ = auVar112._28_4_;
        auVar102 = vfmsub231ps_fma(auVar35,auVar186,auVar133);
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
        _auStack_6f0 = SUB3216(*pauVar2,0x10);
        _local_700 = local_360._16_16_;
        auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar122));
        auVar149 = vcmpps_avx(ZEXT1632(auVar164),ZEXT832(0) << 0x20,2);
        auVar133 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar13),auVar149);
        auVar112 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar17),auVar149);
        auVar150 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar104),auVar149);
        auVar210 = vblendvps_avx(auVar186,ZEXT1632(auVar103),auVar149);
        auVar7 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar139),auVar149);
        auVar195 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar14),auVar149);
        auVar186 = vblendvps_avx(ZEXT1632(auVar103),auVar186,auVar149);
        auVar106 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar123),auVar149);
        auVar164 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar20 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar101),auVar149);
        auVar191 = vsubps_avx(auVar186,auVar133);
        auVar106 = vsubps_avx(auVar106,auVar112);
        auVar18 = vsubps_avx(auVar20,auVar150);
        auVar19 = vsubps_avx(auVar133,auVar210);
        auVar126 = vsubps_avx(auVar112,auVar7);
        auVar127 = vsubps_avx(auVar150,auVar195);
        auVar36._4_4_ = auVar18._4_4_ * auVar133._4_4_;
        auVar36._0_4_ = auVar18._0_4_ * auVar133._0_4_;
        auVar36._8_4_ = auVar18._8_4_ * auVar133._8_4_;
        auVar36._12_4_ = auVar18._12_4_ * auVar133._12_4_;
        auVar36._16_4_ = auVar18._16_4_ * auVar133._16_4_;
        auVar36._20_4_ = auVar18._20_4_ * auVar133._20_4_;
        auVar36._24_4_ = auVar18._24_4_ * auVar133._24_4_;
        auVar36._28_4_ = auVar20._28_4_;
        auVar13 = vfmsub231ps_fma(auVar36,auVar150,auVar191);
        auVar37._4_4_ = auVar191._4_4_ * auVar112._4_4_;
        auVar37._0_4_ = auVar191._0_4_ * auVar112._0_4_;
        auVar37._8_4_ = auVar191._8_4_ * auVar112._8_4_;
        auVar37._12_4_ = auVar191._12_4_ * auVar112._12_4_;
        auVar37._16_4_ = auVar191._16_4_ * auVar112._16_4_;
        auVar37._20_4_ = auVar191._20_4_ * auVar112._20_4_;
        auVar37._24_4_ = auVar191._24_4_ * auVar112._24_4_;
        auVar37._28_4_ = auVar186._28_4_;
        auVar14 = vfmsub231ps_fma(auVar37,auVar133,auVar106);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar109._0_4_ = auVar106._0_4_ * auVar150._0_4_;
        auVar109._4_4_ = auVar106._4_4_ * auVar150._4_4_;
        auVar109._8_4_ = auVar106._8_4_ * auVar150._8_4_;
        auVar109._12_4_ = auVar106._12_4_ * auVar150._12_4_;
        auVar109._16_4_ = auVar106._16_4_ * auVar150._16_4_;
        auVar109._20_4_ = auVar106._20_4_ * auVar150._20_4_;
        auVar109._24_4_ = auVar106._24_4_ * auVar150._24_4_;
        auVar109._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar109,auVar112,auVar18);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar110._0_4_ = auVar127._0_4_ * auVar210._0_4_;
        auVar110._4_4_ = auVar127._4_4_ * auVar210._4_4_;
        auVar110._8_4_ = auVar127._8_4_ * auVar210._8_4_;
        auVar110._12_4_ = auVar127._12_4_ * auVar210._12_4_;
        auVar110._16_4_ = auVar127._16_4_ * auVar210._16_4_;
        auVar110._20_4_ = auVar127._20_4_ * auVar210._20_4_;
        auVar110._24_4_ = auVar127._24_4_ * auVar210._24_4_;
        auVar110._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar110,auVar19,auVar195);
        auVar38._4_4_ = auVar126._4_4_ * auVar195._4_4_;
        auVar38._0_4_ = auVar126._0_4_ * auVar195._0_4_;
        auVar38._8_4_ = auVar126._8_4_ * auVar195._8_4_;
        auVar38._12_4_ = auVar126._12_4_ * auVar195._12_4_;
        auVar38._16_4_ = auVar126._16_4_ * auVar195._16_4_;
        auVar38._20_4_ = auVar126._20_4_ * auVar195._20_4_;
        auVar38._24_4_ = auVar126._24_4_ * auVar195._24_4_;
        auVar38._28_4_ = auVar195._28_4_;
        auVar17 = vfmsub231ps_fma(auVar38,auVar7,auVar127);
        auVar39._4_4_ = auVar19._4_4_ * auVar7._4_4_;
        auVar39._0_4_ = auVar19._0_4_ * auVar7._0_4_;
        auVar39._8_4_ = auVar19._8_4_ * auVar7._8_4_;
        auVar39._12_4_ = auVar19._12_4_ * auVar7._12_4_;
        auVar39._16_4_ = auVar19._16_4_ * auVar7._16_4_;
        auVar39._20_4_ = auVar19._20_4_ * auVar7._20_4_;
        auVar39._24_4_ = auVar19._24_4_ * auVar7._24_4_;
        auVar39._28_4_ = auVar7._28_4_;
        auVar104 = vfmsub231ps_fma(auVar39,auVar126,auVar210);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar210 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar17));
        auVar210 = vcmpps_avx(auVar210,ZEXT832(0) << 0x20,2);
        auVar13 = vpackssdw_avx(auVar210._0_16_,auVar210._16_16_);
        auVar164 = vpand_avx(auVar164,auVar13);
        auVar210 = vpmovsxwd_avx2(auVar164);
        if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar210 >> 0x7f,0) == '\0') &&
              (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar210 >> 0xbf,0) == '\0') &&
            (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar210[0x1f]) {
LAB_015c83a5:
          auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar204 = ZEXT3264(auVar201);
        }
        else {
          auVar40._4_4_ = auVar106._4_4_ * auVar127._4_4_;
          auVar40._0_4_ = auVar106._0_4_ * auVar127._0_4_;
          auVar40._8_4_ = auVar106._8_4_ * auVar127._8_4_;
          auVar40._12_4_ = auVar106._12_4_ * auVar127._12_4_;
          auVar40._16_4_ = auVar106._16_4_ * auVar127._16_4_;
          auVar40._20_4_ = auVar106._20_4_ * auVar127._20_4_;
          auVar40._24_4_ = auVar106._24_4_ * auVar127._24_4_;
          auVar40._28_4_ = auVar210._28_4_;
          auVar139 = vfmsub231ps_fma(auVar40,auVar126,auVar18);
          auVar129._0_4_ = auVar19._0_4_ * auVar18._0_4_;
          auVar129._4_4_ = auVar19._4_4_ * auVar18._4_4_;
          auVar129._8_4_ = auVar19._8_4_ * auVar18._8_4_;
          auVar129._12_4_ = auVar19._12_4_ * auVar18._12_4_;
          auVar129._16_4_ = auVar19._16_4_ * auVar18._16_4_;
          auVar129._20_4_ = auVar19._20_4_ * auVar18._20_4_;
          auVar129._24_4_ = auVar19._24_4_ * auVar18._24_4_;
          auVar129._28_4_ = 0;
          auVar103 = vfmsub231ps_fma(auVar129,auVar191,auVar127);
          auVar41._4_4_ = auVar191._4_4_ * auVar126._4_4_;
          auVar41._0_4_ = auVar191._0_4_ * auVar126._0_4_;
          auVar41._8_4_ = auVar191._8_4_ * auVar126._8_4_;
          auVar41._12_4_ = auVar191._12_4_ * auVar126._12_4_;
          auVar41._16_4_ = auVar191._16_4_ * auVar126._16_4_;
          auVar41._20_4_ = auVar191._20_4_ * auVar126._20_4_;
          auVar41._24_4_ = auVar191._24_4_ * auVar126._24_4_;
          auVar41._28_4_ = auVar191._28_4_;
          auVar122 = vfmsub231ps_fma(auVar41,auVar19,auVar106);
          auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar122));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar139),_DAT_01faff00);
          auVar210 = vrcpps_avx(ZEXT1632(auVar104));
          auVar203._8_4_ = 0x3f800000;
          auVar203._0_8_ = 0x3f8000003f800000;
          auVar203._12_4_ = 0x3f800000;
          auVar203._16_4_ = 0x3f800000;
          auVar203._20_4_ = 0x3f800000;
          auVar203._24_4_ = 0x3f800000;
          auVar203._28_4_ = 0x3f800000;
          auVar13 = vfnmadd213ps_fma(auVar210,ZEXT1632(auVar104),auVar203);
          auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar210,auVar210);
          auVar42._4_4_ = auVar122._4_4_ * auVar150._4_4_;
          auVar42._0_4_ = auVar122._0_4_ * auVar150._0_4_;
          auVar42._8_4_ = auVar122._8_4_ * auVar150._8_4_;
          auVar42._12_4_ = auVar122._12_4_ * auVar150._12_4_;
          auVar42._16_4_ = auVar150._16_4_ * 0.0;
          auVar42._20_4_ = auVar150._20_4_ * 0.0;
          auVar42._24_4_ = auVar150._24_4_ * 0.0;
          auVar42._28_4_ = auVar150._28_4_;
          auVar103 = vfmadd231ps_fma(auVar42,auVar112,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar139),auVar133);
          fVar137 = auVar13._0_4_;
          fVar113 = auVar13._4_4_;
          fVar114 = auVar13._8_4_;
          fVar115 = auVar13._12_4_;
          auVar43._28_4_ = auVar112._28_4_;
          auVar43._0_28_ =
               ZEXT1628(CONCAT412(fVar115 * auVar103._12_4_,
                                  CONCAT48(fVar114 * auVar103._8_4_,
                                           CONCAT44(fVar113 * auVar103._4_4_,
                                                    fVar137 * auVar103._0_4_))));
          auVar111._4_4_ = uVar92;
          auVar111._0_4_ = uVar92;
          auVar111._8_4_ = uVar92;
          auVar111._12_4_ = uVar92;
          auVar111._16_4_ = uVar92;
          auVar111._20_4_ = uVar92;
          auVar111._24_4_ = uVar92;
          auVar111._28_4_ = uVar92;
          uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar130._4_4_ = uVar99;
          auVar130._0_4_ = uVar99;
          auVar130._8_4_ = uVar99;
          auVar130._12_4_ = uVar99;
          auVar130._16_4_ = uVar99;
          auVar130._20_4_ = uVar99;
          auVar130._24_4_ = uVar99;
          auVar130._28_4_ = uVar99;
          auVar133 = vcmpps_avx(auVar111,auVar43,2);
          auVar112 = vcmpps_avx(auVar43,auVar130,2);
          auVar133 = vandps_avx(auVar112,auVar133);
          auVar13 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          auVar164 = vpand_avx(auVar164,auVar13);
          auVar133 = vpmovsxwd_avx2(auVar164);
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar133 >> 0x7f,0) == '\0') &&
                (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0xbf,0) == '\0') &&
              (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar133[0x1f]) goto LAB_015c83a5;
          auVar133 = vcmpps_avx(ZEXT1632(auVar104),ZEXT832(0) << 0x20,4);
          auVar13 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          auVar164 = vpand_avx(auVar164,auVar13);
          auVar133 = vpmovsxwd_avx2(auVar164);
          auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar204 = ZEXT3264(auVar201);
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0x7f,0) != '\0') ||
                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0xbf,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar133[0x1f] < '\0') {
            auVar112 = ZEXT1632(CONCAT412(fVar115 * auVar14._12_4_,
                                          CONCAT48(fVar114 * auVar14._8_4_,
                                                   CONCAT44(fVar113 * auVar14._4_4_,
                                                            fVar137 * auVar14._0_4_))));
            auVar44._28_4_ = local_480._28_4_;
            auVar44._0_28_ =
                 ZEXT1628(CONCAT412(fVar115 * auVar17._12_4_,
                                    CONCAT48(fVar114 * auVar17._8_4_,
                                             CONCAT44(fVar113 * auVar17._4_4_,
                                                      fVar137 * auVar17._0_4_))));
            auVar168._8_4_ = 0x3f800000;
            auVar168._0_8_ = 0x3f8000003f800000;
            auVar168._12_4_ = 0x3f800000;
            auVar168._16_4_ = 0x3f800000;
            auVar168._20_4_ = 0x3f800000;
            auVar168._24_4_ = 0x3f800000;
            auVar168._28_4_ = 0x3f800000;
            auVar201 = vsubps_avx(auVar168,auVar112);
            auVar201 = vblendvps_avx(auVar201,auVar112,auVar149);
            auVar204 = ZEXT3264(auVar201);
            auVar201 = vsubps_avx(auVar168,auVar44);
            local_380 = vblendvps_avx(auVar201,auVar44,auVar149);
            auVar179 = ZEXT3264(auVar133);
            local_480 = auVar43;
          }
        }
        auVar209 = ZEXT3264(_local_620);
        auVar135 = ZEXT3264(auVar154);
        auVar133 = auVar179._0_32_;
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0x7f,0) == '\0') &&
              (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar133 >> 0xbf,0) == '\0') &&
            (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar179[0x1f]) goto LAB_015c6e0d;
        auVar201 = vsubps_avx(ZEXT1632(auVar16),auVar213);
        local_720 = auVar204._0_32_;
        auVar164 = vfmadd213ps_fma(auVar201,local_720,auVar213);
        fVar137 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar201._4_4_ = (auVar164._4_4_ + auVar164._4_4_) * fVar137;
        auVar201._0_4_ = (auVar164._0_4_ + auVar164._0_4_) * fVar137;
        auVar201._8_4_ = (auVar164._8_4_ + auVar164._8_4_) * fVar137;
        auVar201._12_4_ = (auVar164._12_4_ + auVar164._12_4_) * fVar137;
        auVar201._16_4_ = fVar137 * 0.0;
        auVar201._20_4_ = fVar137 * 0.0;
        auVar201._24_4_ = fVar137 * 0.0;
        auVar201._28_4_ = 0;
        auVar201 = vcmpps_avx(local_480,auVar201,6);
        auVar112 = auVar133 & auVar201;
        auVar183 = ZEXT3264(CONCAT428(local_6a0,
                                      CONCAT424(local_6a0,
                                                CONCAT420(local_6a0,
                                                          CONCAT416(local_6a0,
                                                                    CONCAT412(local_6a0,
                                                                              CONCAT48(local_6a0,
                                                                                       CONCAT44(
                                                  local_6a0,local_6a0))))))));
        auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,CONCAT416(fVar152,
                                                  CONCAT412(fVar158,CONCAT48(fVar152,uVar100)))))));
        auVar188 = ZEXT3264(local_6c0);
        if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0x7f,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0xbf,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar112[0x1f] < '\0') {
          auVar131._8_4_ = 0xbf800000;
          auVar131._0_8_ = 0xbf800000bf800000;
          auVar131._12_4_ = 0xbf800000;
          auVar131._16_4_ = 0xbf800000;
          auVar131._20_4_ = 0xbf800000;
          auVar131._24_4_ = 0xbf800000;
          auVar131._28_4_ = 0xbf800000;
          auVar148._8_4_ = 0x40000000;
          auVar148._0_8_ = 0x4000000040000000;
          auVar148._12_4_ = 0x40000000;
          auVar148._16_4_ = 0x40000000;
          auVar148._20_4_ = 0x40000000;
          auVar148._24_4_ = 0x40000000;
          auVar148._28_4_ = 0x40000000;
          auVar164 = vfmadd213ps_fma(local_380,auVar148,auVar131);
          local_240 = ZEXT1632(auVar164);
          local_200 = 0;
          local_1e0 = local_660._0_8_;
          uStack_1d8 = local_660._8_8_;
          local_1d0 = local_670._0_8_;
          uStack_1c8 = local_670._8_8_;
          local_380 = local_240;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar157 = ZEXT3264(local_6e0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar93 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar133 = vandps_avx(auVar201,auVar133);
              fVar137 = 1.0 / auVar107._0_4_;
              local_180[0] = fVar137 * (auVar204._0_4_ + 0.0);
              local_180[1] = fVar137 * (auVar204._4_4_ + 1.0);
              local_180[2] = fVar137 * (auVar204._8_4_ + 2.0);
              local_180[3] = fVar137 * (auVar204._12_4_ + 3.0);
              fStack_170 = fVar137 * (auVar204._16_4_ + 4.0);
              fStack_16c = fVar137 * (auVar204._20_4_ + 5.0);
              fStack_168 = fVar137 * (auVar204._24_4_ + 6.0);
              fStack_164 = auVar204._28_4_ + 7.0;
              local_380._0_8_ = auVar164._0_8_;
              local_380._8_8_ = auVar164._8_8_;
              local_160 = local_380._0_8_;
              uStack_158 = local_380._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_480;
              uVar92 = vmovmskps_avx(auVar133);
              if (uVar92 == 0) goto LAB_015c6ee2;
              lVar98 = 0;
              local_840._0_8_ = ZEXT48(uVar92 & 0xff);
              for (uVar93 = local_840._0_8_; (uVar93 & 1) == 0;
                  uVar93 = uVar93 >> 1 | 0x8000000000000000) {
                lVar98 = lVar98 + 1;
              }
              local_600._0_16_ = CONCAT412(uVar94,CONCAT48(uVar94,CONCAT44(uVar94,uVar94)));
              local_600 = ZEXT1632(local_600._0_16_);
              local_820 = CONCAT44(local_570,local_570);
              uStack_818._0_4_ = local_570;
              uStack_818._4_4_ = local_570;
              local_5c0 = ZEXT1632(*(undefined1 (*) [16])
                                    (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10));
              local_4c0 = ZEXT1632(CONCAT124(auVar15._4_12_,*(undefined4 *)(ray + k * 4 + 0x80)));
              local_5e0 = auVar154;
              local_260 = local_720;
              local_220 = local_480;
              local_1fc = iVar9;
              local_1f0 = local_680;
              uStack_1e8 = uStack_678;
              do {
                fVar137 = local_180[lVar98];
                local_400._4_4_ = fVar137;
                local_400._0_4_ = fVar137;
                local_400._8_4_ = fVar137;
                local_400._12_4_ = fVar137;
                local_700 = (undefined1  [8])lVar98;
                local_3f0 = *(undefined4 *)((long)&local_160 + lVar98 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + lVar98 * 4);
                fVar114 = 1.0 - fVar137;
                auVar164 = ZEXT416((uint)(fVar137 * fVar114 * 4.0));
                auVar13 = vfnmsub213ss_fma(local_400,local_400,auVar164);
                auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),auVar164);
                fVar113 = auVar164._0_4_ * 0.5;
                fVar137 = fVar137 * fVar137 * 0.5;
                auVar162._0_4_ = fVar137 * (float)local_530._0_4_;
                auVar162._4_4_ = fVar137 * (float)local_530._4_4_;
                auVar162._8_4_ = fVar137 * fStack_528;
                auVar162._12_4_ = fVar137 * fStack_524;
                auVar140._4_4_ = fVar113;
                auVar140._0_4_ = fVar113;
                auVar140._8_4_ = fVar113;
                auVar140._12_4_ = fVar113;
                auVar164 = vfmadd132ps_fma(auVar140,auVar162,local_670);
                fVar137 = auVar13._0_4_ * 0.5;
                auVar163._4_4_ = fVar137;
                auVar163._0_4_ = fVar137;
                auVar163._8_4_ = fVar137;
                auVar163._12_4_ = fVar137;
                auVar164 = vfmadd132ps_fma(auVar163,auVar164,local_660);
                local_650.context = context->user;
                fVar137 = fVar114 * -fVar114 * 0.5;
                auVar141._4_4_ = fVar137;
                auVar141._0_4_ = fVar137;
                auVar141._8_4_ = fVar137;
                auVar141._12_4_ = fVar137;
                auVar86._8_8_ = uStack_678;
                auVar86._0_8_ = local_680;
                auVar164 = vfmadd132ps_fma(auVar141,auVar164,auVar86);
                local_430 = auVar164._0_4_;
                local_420 = vshufps_avx(auVar164,auVar164,0x55);
                local_410 = vshufps_avx(auVar164,auVar164,0xaa);
                local_3e0 = local_820;
                uStack_3d8 = uStack_818;
                local_3d0 = local_600._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_600._0_16_),ZEXT1632(local_600._0_16_));
                uStack_3bc = (local_650.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_650.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_740 = local_5c0._0_16_;
                local_650.valid = (int *)local_740;
                local_650.geometryUserPtr = *(void **)(CONCAT44(uStack_4fc,local_500) + 0x18);
                local_650.hit = (RTCHitN *)&local_430;
                local_650.N = 4;
                pcVar11 = *(code **)(CONCAT44(uStack_4fc,local_500) + 0x48);
                local_650.ray = (RTCRayN *)ray;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (pcVar11 != (code *)0x0) {
                  (*pcVar11)(&local_650);
                  auVar209 = ZEXT3264(_local_620);
                  auVar135 = ZEXT3264(local_5e0);
                  auVar188 = ZEXT3264(local_6c0);
                  auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                                CONCAT424(fStack_688,
                                                          CONCAT420(fStack_68c,
                                                                    CONCAT416(fStack_690,
                                                                              CONCAT412(fStack_694,
                                                                                        CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                  auVar204 = ZEXT3264(local_720);
                }
                if (local_740 == (undefined1  [16])0x0) {
                  auVar164 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar164 = auVar164 ^ _DAT_01f7ae20;
                  auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                  auVar157 = ZEXT3264(local_6e0);
                }
                else {
                  p_Var12 = context->args->filter;
                  if (p_Var12 == (RTCFilterFunctionN)0x0) {
                    auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                    auVar157 = ZEXT3264(local_6e0);
                  }
                  else {
                    auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                    auVar157 = ZEXT3264(local_6e0);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       ((*(byte *)(CONCAT44(uStack_4fc,local_500) + 0x3e) & 0x40) != 0)) {
                      (*p_Var12)(&local_650);
                      auVar209 = ZEXT3264(_local_620);
                      auVar135 = ZEXT3264(local_5e0);
                      auVar157 = ZEXT3264(local_6e0);
                      auVar188 = ZEXT3264(local_6c0);
                      auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                      auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                                    CONCAT424(fStack_688,
                                                              CONCAT420(fStack_68c,
                                                                        CONCAT416(fStack_690,
                                                                                  CONCAT412(
                                                  fStack_694,
                                                  CONCAT48(fStack_698,CONCAT44(fStack_69c,local_6a0)
                                                          )))))));
                      auVar204 = ZEXT3264(local_720);
                    }
                  }
                  auVar13 = vpcmpeqd_avx(local_740,_DAT_01f7aa10);
                  auVar164 = auVar13 ^ _DAT_01f7ae20;
                  auVar142._8_4_ = 0xff800000;
                  auVar142._0_8_ = 0xff800000ff800000;
                  auVar142._12_4_ = 0xff800000;
                  auVar13 = vblendvps_avx(auVar142,*(undefined1 (*) [16])(local_650.ray + 0x80),
                                          auVar13);
                  *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar13;
                }
                auVar154 = auVar135._0_32_;
                auVar124._8_8_ = 0x100000001;
                auVar124._0_8_ = 0x100000001;
                if ((auVar124 & auVar164) != (undefined1  [16])0x0) {
                  uVar93 = CONCAT71(local_700._1_7_,1);
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                uVar93 = 0;
                lVar98 = 0;
                local_840._0_8_ = local_840._0_8_ ^ 1L << ((ulong)local_700 & 0x3f);
                for (uVar96 = local_840._0_8_; (uVar96 & 1) == 0;
                    uVar96 = uVar96 >> 1 | 0x8000000000000000) {
                  lVar98 = lVar98 + 1;
                }
              } while (local_840._0_8_ != 0);
            }
            goto LAB_015c6e31;
          }
          goto LAB_015c6e28;
        }
LAB_015c6ee2:
        auVar157 = ZEXT3264(local_6e0);
        uVar93 = 0;
      }
LAB_015c6e31:
      auVar196 = ZEXT3264(auVar196._0_32_);
      uVar94 = (uint)uVar93;
      auVar135 = ZEXT3264(local_5a0);
      if (8 < iVar9) {
        local_340._4_4_ = iVar9;
        local_340._0_4_ = iVar9;
        local_340._8_4_ = iVar9;
        local_340._12_4_ = iVar9;
        local_340._16_4_ = iVar9;
        local_340._20_4_ = iVar9;
        local_340._24_4_ = iVar9;
        local_340._28_4_ = iVar9;
        local_360._4_4_ = fVar138;
        local_360._0_4_ = fVar138;
        fStack_358 = fVar138;
        fStack_354 = fVar138;
        fStack_350 = fVar138;
        fStack_34c = fVar138;
        fStack_348 = fVar138;
        fStack_344 = fVar138;
        local_500 = local_560._0_4_;
        uStack_4fc = local_560._0_4_;
        uStack_4f8 = local_560._0_4_;
        uStack_4f4 = local_560._0_4_;
        uStack_4f0 = local_560._0_4_;
        uStack_4ec = local_560._0_4_;
        uStack_4e8 = local_560._0_4_;
        uStack_4e4 = local_560._0_4_;
        local_120 = 1.0 / (float)local_460._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_290 = (undefined4)local_728;
        uStack_28c = (undefined4)local_728;
        uStack_288 = (undefined4)local_728;
        uStack_284 = (undefined4)local_728;
        uStack_56c = local_570;
        uStack_568 = local_570;
        uStack_564 = local_570;
        lVar98 = 8;
        local_720 = auVar204._0_32_;
        _local_620 = auVar209._0_32_;
        local_5e0 = auVar154;
        do {
          local_600._0_4_ = (int)uVar93;
          auVar191 = auVar196._0_32_;
          local_5a0 = auVar135._0_32_;
          auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 * 4 + lVar21);
          auVar201 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar98 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar98 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar98 * 4);
          fVar118 = *(float *)*pauVar2;
          fVar75 = *(float *)(*pauVar2 + 4);
          fVar76 = *(float *)(*pauVar2 + 8);
          fVar77 = *(float *)(*pauVar2 + 0xc);
          fVar78 = *(float *)(*pauVar2 + 0x10);
          fVar79 = *(float *)(*pauVar2 + 0x14);
          fVar80 = *(float *)(*pauVar2 + 0x18);
          auVar89 = *(undefined1 (*) [28])*pauVar2;
          auVar208._0_4_ = fVar118 * auVar183._0_4_;
          auVar208._4_4_ = fVar75 * auVar183._4_4_;
          auVar208._8_4_ = fVar76 * auVar183._8_4_;
          auVar208._12_4_ = fVar77 * auVar183._12_4_;
          auVar208._16_4_ = fVar78 * auVar183._16_4_;
          auVar208._20_4_ = fVar79 * auVar183._20_4_;
          auVar208._28_36_ = auVar209._28_36_;
          auVar208._24_4_ = fVar80 * auVar183._24_4_;
          auVar196._0_4_ = fVar118 * auVar179._0_4_;
          auVar196._4_4_ = fVar75 * auVar179._4_4_;
          auVar196._8_4_ = fVar76 * auVar179._8_4_;
          auVar196._12_4_ = fVar77 * auVar179._12_4_;
          auVar196._16_4_ = fVar78 * auVar179._16_4_;
          auVar196._20_4_ = fVar79 * auVar179._20_4_;
          auVar196._28_36_ = auVar135._28_36_;
          auVar196._24_4_ = fVar80 * auVar179._24_4_;
          auVar164 = vfmadd231ps_fma(auVar208._0_32_,auVar112,auVar146);
          auVar13 = vfmadd231ps_fma(auVar196._0_32_,auVar112,auVar202);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar201,auVar188._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar201,auVar215);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar133,auVar157._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_4e0);
          auVar150 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 * 4 + lVar21);
          auVar210 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar98 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar98 * 4);
          pauVar3 = (undefined1 (*) [32])(lVar21 + 0x21b1cd4 + lVar98 * 4);
          fVar119 = *(float *)*pauVar3;
          fVar136 = *(float *)(*pauVar3 + 4);
          fVar81 = *(float *)(*pauVar3 + 8);
          fVar82 = *(float *)(*pauVar3 + 0xc);
          fVar83 = *(float *)(*pauVar3 + 0x10);
          fVar84 = *(float *)(*pauVar3 + 0x14);
          fVar85 = *(float *)(*pauVar3 + 0x18);
          auVar90 = *(undefined1 (*) [28])*pauVar3;
          auVar209._0_4_ = fVar119 * auVar183._0_4_;
          auVar209._4_4_ = fVar136 * auVar183._4_4_;
          auVar209._8_4_ = fVar81 * auVar183._8_4_;
          auVar209._12_4_ = fVar82 * auVar183._12_4_;
          auVar209._16_4_ = fVar83 * auVar183._16_4_;
          auVar209._20_4_ = fVar84 * auVar183._20_4_;
          auVar209._28_36_ = auVar183._28_36_;
          auVar209._24_4_ = fVar85 * auVar183._24_4_;
          auVar45._4_4_ = fVar136 * auVar179._4_4_;
          auVar45._0_4_ = fVar119 * auVar179._0_4_;
          auVar45._8_4_ = fVar81 * auVar179._8_4_;
          auVar45._12_4_ = fVar82 * auVar179._12_4_;
          auVar45._16_4_ = fVar83 * auVar179._16_4_;
          auVar45._20_4_ = fVar84 * auVar179._20_4_;
          auVar45._24_4_ = fVar85 * auVar179._24_4_;
          auVar45._28_4_ = auVar133._28_4_;
          auVar14 = vfmadd231ps_fma(auVar209._0_32_,auVar7,auVar146);
          auVar15 = vfmadd231ps_fma(auVar45,auVar7,auVar202);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar210,auVar188._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar210,auVar215);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,auVar157._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar150,local_4e0);
          local_2e0 = ZEXT1632(auVar14);
          local_4c0 = ZEXT1632(auVar164);
          auVar186 = vsubps_avx(local_2e0,local_4c0);
          auVar149 = ZEXT1632(auVar15);
          local_560 = ZEXT1632(auVar13);
          local_2c0 = vsubps_avx(auVar149,local_560);
          auVar46._4_4_ = auVar186._4_4_ * auVar13._4_4_;
          auVar46._0_4_ = auVar186._0_4_ * auVar13._0_4_;
          auVar46._8_4_ = auVar186._8_4_ * auVar13._8_4_;
          auVar46._12_4_ = auVar186._12_4_ * auVar13._12_4_;
          auVar46._16_4_ = auVar186._16_4_ * 0.0;
          auVar46._20_4_ = auVar186._20_4_ * 0.0;
          auVar46._24_4_ = auVar186._24_4_ * 0.0;
          auVar46._28_4_ = auVar7._28_4_;
          fVar138 = local_2c0._0_4_;
          auVar132._0_4_ = auVar164._0_4_ * fVar138;
          fVar137 = local_2c0._4_4_;
          auVar132._4_4_ = auVar164._4_4_ * fVar137;
          fVar113 = local_2c0._8_4_;
          auVar132._8_4_ = auVar164._8_4_ * fVar113;
          fVar114 = local_2c0._12_4_;
          auVar132._12_4_ = auVar164._12_4_ * fVar114;
          fVar115 = local_2c0._16_4_;
          auVar132._16_4_ = fVar115 * 0.0;
          fVar116 = local_2c0._20_4_;
          auVar132._20_4_ = fVar116 * 0.0;
          fVar117 = local_2c0._24_4_;
          auVar132._24_4_ = fVar117 * 0.0;
          auVar132._28_4_ = 0;
          auVar209 = ZEXT3264(auVar112);
          auVar106 = vsubps_avx(auVar46,auVar132);
          auVar135._0_4_ = fVar118 * (float)local_e0;
          auVar135._4_4_ = fVar75 * local_e0._4_4_;
          auVar135._8_4_ = fVar76 * (float)uStack_d8;
          auVar135._12_4_ = fVar77 * uStack_d8._4_4_;
          auVar135._16_4_ = fVar78 * (float)uStack_d0;
          auVar135._20_4_ = fVar79 * uStack_d0._4_4_;
          auVar135._28_36_ = auVar179._28_36_;
          auVar135._24_4_ = fVar80 * (float)uStack_c8;
          auVar164 = vfmadd231ps_fma(auVar135._0_32_,auVar112,local_c0);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar201,local_a0);
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),local_80,auVar133);
          auVar47._4_4_ = fVar136 * local_e0._4_4_;
          auVar47._0_4_ = fVar119 * (float)local_e0;
          auVar47._8_4_ = fVar81 * (float)uStack_d8;
          auVar47._12_4_ = fVar82 * uStack_d8._4_4_;
          auVar47._16_4_ = fVar83 * (float)uStack_d0;
          auVar47._20_4_ = fVar84 * uStack_d0._4_4_;
          auVar47._24_4_ = fVar85 * (float)uStack_c8;
          auVar47._28_4_ = uStack_c8._4_4_;
          auVar13 = vfmadd231ps_fma(auVar47,auVar7,local_c0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar210,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar150,local_80);
          auVar48._4_4_ = fVar137 * fVar137;
          auVar48._0_4_ = fVar138 * fVar138;
          auVar48._8_4_ = fVar113 * fVar113;
          auVar48._12_4_ = fVar114 * fVar114;
          auVar48._16_4_ = fVar115 * fVar115;
          auVar48._20_4_ = fVar116 * fVar116;
          auVar48._24_4_ = fVar117 * fVar117;
          auVar48._28_4_ = local_80._28_4_;
          auVar14 = vfmadd231ps_fma(auVar48,auVar186,auVar186);
          auVar195 = vmaxps_avx(ZEXT1632(auVar164),ZEXT1632(auVar13));
          auVar192._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar14._0_4_;
          auVar192._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar14._4_4_;
          auVar192._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar14._8_4_;
          auVar192._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar14._12_4_;
          auVar192._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
          auVar192._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
          auVar192._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
          auVar192._28_4_ = 0;
          auVar49._4_4_ = auVar106._4_4_ * auVar106._4_4_;
          auVar49._0_4_ = auVar106._0_4_ * auVar106._0_4_;
          auVar49._8_4_ = auVar106._8_4_ * auVar106._8_4_;
          auVar49._12_4_ = auVar106._12_4_ * auVar106._12_4_;
          auVar49._16_4_ = auVar106._16_4_ * auVar106._16_4_;
          auVar49._20_4_ = auVar106._20_4_ * auVar106._20_4_;
          auVar49._24_4_ = auVar106._24_4_ * auVar106._24_4_;
          auVar49._28_4_ = auVar106._28_4_;
          auVar195 = vcmpps_avx(auVar49,auVar192,2);
          local_200 = (int)lVar98;
          auVar193._4_4_ = local_200;
          auVar193._0_4_ = local_200;
          auVar193._8_4_ = local_200;
          auVar193._12_4_ = local_200;
          auVar193._16_4_ = local_200;
          auVar193._20_4_ = local_200;
          auVar193._24_4_ = local_200;
          auVar193._28_4_ = local_200;
          auVar106 = vpor_avx2(auVar193,_DAT_01fe9900);
          auVar20 = vpcmpgtd_avx2(local_340,auVar106);
          auVar106 = auVar20 & auVar195;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar106 >> 0x7f,0) == '\0') &&
                (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0xbf,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar106[0x1f]) {
            auVar135 = ZEXT3264(local_5a0);
            auVar196 = ZEXT3264(auVar191);
            auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                          CONCAT424(fStack_688,
                                                    CONCAT420(fStack_68c,
                                                              CONCAT416(fStack_690,
                                                                        CONCAT412(fStack_694,
                                                                                  CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
            auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,CONCAT416(
                                                  fVar152,CONCAT412(fVar158,CONCAT48(fVar152,uVar100
                                                                                    )))))));
            auVar188 = ZEXT3264(local_6c0);
            uVar93 = uVar93 & 0xffffffff;
          }
          else {
            local_460 = vandps_avx(auVar20,auVar195);
            local_320._0_4_ = auVar90._0_4_;
            local_320._4_4_ = auVar90._4_4_;
            fStack_318 = auVar90._8_4_;
            fStack_314 = auVar90._12_4_;
            fStack_310 = auVar90._16_4_;
            fStack_30c = auVar90._20_4_;
            fStack_308 = auVar90._24_4_;
            auVar50._4_4_ = (float)local_620._4_4_ * (float)local_320._4_4_;
            auVar50._0_4_ = (float)local_620._0_4_ * (float)local_320._0_4_;
            auVar50._8_4_ = fStack_618 * fStack_318;
            auVar50._12_4_ = fStack_614 * fStack_314;
            auVar50._16_4_ = fStack_610 * fStack_310;
            auVar50._20_4_ = fStack_60c * fStack_30c;
            auVar50._24_4_ = fStack_608 * fStack_308;
            auVar50._28_4_ = auVar195._28_4_;
            auVar14 = vfmadd213ps_fma(auVar7,local_4a0,auVar50);
            auVar14 = vfmadd213ps_fma(auVar210,local_100,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(auVar150,ZEXT1632(auVar14),local_5e0);
            local_300._0_4_ = auVar89._0_4_;
            local_300._4_4_ = auVar89._4_4_;
            fStack_2f8 = auVar89._8_4_;
            fStack_2f4 = auVar89._12_4_;
            fStack_2f0 = auVar89._16_4_;
            fStack_2ec = auVar89._20_4_;
            fStack_2e8 = auVar89._24_4_;
            auVar155._0_4_ = (float)local_620._0_4_ * (float)local_300._0_4_;
            auVar155._4_4_ = (float)local_620._4_4_ * (float)local_300._4_4_;
            auVar155._8_4_ = fStack_618 * fStack_2f8;
            auVar155._12_4_ = fStack_614 * fStack_2f4;
            auVar155._16_4_ = fStack_610 * fStack_2f0;
            auVar155._20_4_ = fStack_60c * fStack_2ec;
            auVar155._24_4_ = fStack_608 * fStack_2e8;
            auVar155._28_4_ = 0;
            auVar16 = vfmadd213ps_fma(auVar112,local_4a0,auVar155);
            auVar16 = vfmadd213ps_fma(auVar201,local_100,ZEXT1632(auVar16));
            auVar201 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar98 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar98 * 4);
            auVar150 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar98 * 4);
            pfVar4 = (float *)(lVar21 + 0x21b0ac4 + lVar98 * 4);
            fVar138 = *pfVar4;
            fVar137 = pfVar4[1];
            fVar113 = pfVar4[2];
            fVar114 = pfVar4[3];
            fVar115 = pfVar4[4];
            fVar116 = pfVar4[5];
            fVar117 = pfVar4[6];
            auVar51._4_4_ = fStack_69c * fVar137;
            auVar51._0_4_ = local_6a0 * fVar138;
            auVar51._8_4_ = fStack_698 * fVar113;
            auVar51._12_4_ = fStack_694 * fVar114;
            auVar51._16_4_ = fStack_690 * fVar115;
            auVar51._20_4_ = fStack_68c * fVar116;
            auVar51._24_4_ = fStack_688 * fVar117;
            auVar51._28_4_ = auVar186._28_4_;
            auVar206._0_4_ = fVar152 * fVar138;
            auVar206._4_4_ = fVar158 * fVar137;
            auVar206._8_4_ = fVar152 * fVar113;
            auVar206._12_4_ = fVar158 * fVar114;
            auVar206._16_4_ = fVar152 * fVar115;
            auVar206._20_4_ = fVar158 * fVar116;
            auVar206._24_4_ = fVar152 * fVar117;
            auVar206._28_4_ = 0;
            auVar52._4_4_ = fVar137 * (float)local_620._4_4_;
            auVar52._0_4_ = fVar138 * (float)local_620._0_4_;
            auVar52._8_4_ = fVar113 * fStack_618;
            auVar52._12_4_ = fVar114 * fStack_614;
            auVar52._16_4_ = fVar115 * fStack_610;
            auVar52._20_4_ = fVar116 * fStack_60c;
            auVar52._24_4_ = fVar117 * fStack_608;
            auVar52._28_4_ = pfVar4[7];
            auVar17 = vfmadd231ps_fma(auVar51,auVar150,auVar146);
            auVar104 = vfmadd231ps_fma(auVar206,auVar150,auVar202);
            auVar103 = vfmadd231ps_fma(auVar52,local_4a0,auVar150);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,local_6c0);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar112,auVar215);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_100,auVar112);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar201,local_6e0);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar201,local_4e0);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_5e0,auVar201);
            pfVar4 = (float *)(lVar21 + 0x21b2ee4 + lVar98 * 4);
            fVar138 = *pfVar4;
            fVar137 = pfVar4[1];
            fVar113 = pfVar4[2];
            fVar114 = pfVar4[3];
            fVar115 = pfVar4[4];
            fVar116 = pfVar4[5];
            fVar117 = pfVar4[6];
            auVar53._4_4_ = fStack_69c * fVar137;
            auVar53._0_4_ = local_6a0 * fVar138;
            auVar53._8_4_ = fStack_698 * fVar113;
            auVar53._12_4_ = fStack_694 * fVar114;
            auVar53._16_4_ = fStack_690 * fVar115;
            auVar53._20_4_ = fStack_68c * fVar116;
            auVar53._24_4_ = fStack_688 * fVar117;
            auVar53._28_4_ = fStack_684;
            auVar54._4_4_ = fVar158 * fVar137;
            auVar54._0_4_ = fVar152 * fVar138;
            auVar54._8_4_ = fVar152 * fVar113;
            auVar54._12_4_ = fVar158 * fVar114;
            auVar54._16_4_ = fVar152 * fVar115;
            auVar54._20_4_ = fVar158 * fVar116;
            auVar54._24_4_ = fVar152 * fVar117;
            auVar54._28_4_ = fVar158;
            auVar55._4_4_ = (float)local_620._4_4_ * fVar137;
            auVar55._0_4_ = (float)local_620._0_4_ * fVar138;
            auVar55._8_4_ = fStack_618 * fVar113;
            auVar55._12_4_ = fStack_614 * fVar114;
            auVar55._16_4_ = fStack_610 * fVar115;
            auVar55._20_4_ = fStack_60c * fVar116;
            auVar55._24_4_ = fStack_608 * fVar117;
            auVar55._28_4_ = pfVar4[7];
            auVar201 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar98 * 4);
            auVar139 = vfmadd231ps_fma(auVar53,auVar201,auVar146);
            auVar122 = vfmadd231ps_fma(auVar54,auVar201,auVar202);
            auVar102 = vfmadd231ps_fma(auVar55,local_4a0,auVar201);
            auVar201 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar98 * 4);
            auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar201,local_6c0);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar201,auVar215);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_100,auVar201);
            auVar201 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar98 * 4);
            auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar201,local_6e0);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar201,local_4e0);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_5e0,auVar201);
            auVar194._8_4_ = 0x7fffffff;
            auVar194._0_8_ = 0x7fffffff7fffffff;
            auVar194._12_4_ = 0x7fffffff;
            auVar194._16_4_ = 0x7fffffff;
            auVar194._20_4_ = 0x7fffffff;
            auVar194._24_4_ = 0x7fffffff;
            auVar194._28_4_ = 0x7fffffff;
            auVar201 = vandps_avx(ZEXT1632(auVar17),auVar194);
            auVar112 = vandps_avx(ZEXT1632(auVar104),auVar194);
            auVar112 = vmaxps_avx(auVar201,auVar112);
            auVar201 = vandps_avx(ZEXT1632(auVar103),auVar194);
            auVar201 = vmaxps_avx(auVar112,auVar201);
            auVar201 = vcmpps_avx(auVar201,_local_360,1);
            auVar150 = vblendvps_avx(ZEXT1632(auVar17),auVar186,auVar201);
            auVar210 = vblendvps_avx(ZEXT1632(auVar104),local_2c0,auVar201);
            auVar201 = vandps_avx(ZEXT1632(auVar139),auVar194);
            auVar112 = vandps_avx(ZEXT1632(auVar122),auVar194);
            auVar112 = vmaxps_avx(auVar201,auVar112);
            auVar201 = vandps_avx(auVar194,ZEXT1632(auVar102));
            auVar201 = vmaxps_avx(auVar112,auVar201);
            auVar112 = vcmpps_avx(auVar201,_local_360,1);
            auVar201 = vblendvps_avx(ZEXT1632(auVar139),auVar186,auVar112);
            auVar112 = vblendvps_avx(ZEXT1632(auVar122),local_2c0,auVar112);
            auVar16 = vfmadd213ps_fma(auVar133,local_5e0,ZEXT1632(auVar16));
            auVar17 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar210,auVar210);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar17));
            fVar138 = auVar133._0_4_;
            fVar137 = auVar133._4_4_;
            fVar113 = auVar133._8_4_;
            fVar114 = auVar133._12_4_;
            fVar115 = auVar133._16_4_;
            fVar116 = auVar133._20_4_;
            fVar117 = auVar133._24_4_;
            auVar56._4_4_ = fVar137 * fVar137 * fVar137 * auVar17._4_4_ * -0.5;
            auVar56._0_4_ = fVar138 * fVar138 * fVar138 * auVar17._0_4_ * -0.5;
            auVar56._8_4_ = fVar113 * fVar113 * fVar113 * auVar17._8_4_ * -0.5;
            auVar56._12_4_ = fVar114 * fVar114 * fVar114 * auVar17._12_4_ * -0.5;
            auVar56._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar56._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar56._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar56._28_4_ = 0;
            auVar214._8_4_ = 0x3fc00000;
            auVar214._0_8_ = 0x3fc000003fc00000;
            auVar214._12_4_ = 0x3fc00000;
            auVar214._16_4_ = 0x3fc00000;
            auVar214._20_4_ = 0x3fc00000;
            auVar214._24_4_ = 0x3fc00000;
            auVar214._28_4_ = 0x3fc00000;
            auVar17 = vfmadd231ps_fma(auVar56,auVar214,auVar133);
            fVar138 = auVar17._0_4_;
            fVar137 = auVar17._4_4_;
            auVar57._4_4_ = auVar210._4_4_ * fVar137;
            auVar57._0_4_ = auVar210._0_4_ * fVar138;
            fVar113 = auVar17._8_4_;
            auVar57._8_4_ = auVar210._8_4_ * fVar113;
            fVar114 = auVar17._12_4_;
            auVar57._12_4_ = auVar210._12_4_ * fVar114;
            auVar57._16_4_ = auVar210._16_4_ * 0.0;
            auVar57._20_4_ = auVar210._20_4_ * 0.0;
            auVar57._24_4_ = auVar210._24_4_ * 0.0;
            auVar57._28_4_ = auVar133._28_4_;
            auVar58._4_4_ = fVar137 * -auVar150._4_4_;
            auVar58._0_4_ = fVar138 * -auVar150._0_4_;
            auVar58._8_4_ = fVar113 * -auVar150._8_4_;
            auVar58._12_4_ = fVar114 * -auVar150._12_4_;
            auVar58._16_4_ = -auVar150._16_4_ * 0.0;
            auVar58._20_4_ = -auVar150._20_4_ * 0.0;
            auVar58._24_4_ = -auVar150._24_4_ * 0.0;
            auVar58._28_4_ = auVar210._28_4_;
            auVar17 = vfmadd213ps_fma(auVar201,auVar201,ZEXT832(0) << 0x20);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,auVar112);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar17));
            auVar59._28_4_ = auVar186._28_4_;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar114 * 0.0,
                                    CONCAT48(fVar113 * 0.0,CONCAT44(fVar137 * 0.0,fVar138 * 0.0))));
            fVar138 = auVar133._0_4_;
            fVar137 = auVar133._4_4_;
            fVar113 = auVar133._8_4_;
            fVar114 = auVar133._12_4_;
            fVar115 = auVar133._16_4_;
            fVar116 = auVar133._20_4_;
            fVar117 = auVar133._24_4_;
            auVar60._4_4_ = fVar137 * fVar137 * fVar137 * auVar17._4_4_ * -0.5;
            auVar60._0_4_ = fVar138 * fVar138 * fVar138 * auVar17._0_4_ * -0.5;
            auVar60._8_4_ = fVar113 * fVar113 * fVar113 * auVar17._8_4_ * -0.5;
            auVar60._12_4_ = fVar114 * fVar114 * fVar114 * auVar17._12_4_ * -0.5;
            auVar60._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar60._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar60._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
            auVar60._28_4_ = 0;
            auVar17 = vfmadd231ps_fma(auVar60,auVar214,auVar133);
            fVar138 = auVar17._0_4_;
            fVar137 = auVar17._4_4_;
            auVar61._4_4_ = auVar112._4_4_ * fVar137;
            auVar61._0_4_ = auVar112._0_4_ * fVar138;
            fVar113 = auVar17._8_4_;
            auVar61._8_4_ = auVar112._8_4_ * fVar113;
            fVar114 = auVar17._12_4_;
            auVar61._12_4_ = auVar112._12_4_ * fVar114;
            auVar61._16_4_ = auVar112._16_4_ * 0.0;
            auVar61._20_4_ = auVar112._20_4_ * 0.0;
            auVar61._24_4_ = auVar112._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar62._4_4_ = fVar137 * -auVar201._4_4_;
            auVar62._0_4_ = fVar138 * -auVar201._0_4_;
            auVar62._8_4_ = fVar113 * -auVar201._8_4_;
            auVar62._12_4_ = fVar114 * -auVar201._12_4_;
            auVar62._16_4_ = -auVar201._16_4_ * 0.0;
            auVar62._20_4_ = -auVar201._20_4_ * 0.0;
            auVar62._24_4_ = -auVar201._24_4_ * 0.0;
            auVar62._28_4_ = auVar133._28_4_;
            auVar63._28_4_ = 0xbf000000;
            auVar63._0_28_ =
                 ZEXT1628(CONCAT412(fVar114 * 0.0,
                                    CONCAT48(fVar113 * 0.0,CONCAT44(fVar137 * 0.0,fVar138 * 0.0))));
            auVar17 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar164),local_4c0);
            auVar133 = ZEXT1632(auVar164);
            auVar104 = vfmadd213ps_fma(auVar58,auVar133,local_560);
            auVar103 = vfmadd213ps_fma(auVar59,auVar133,ZEXT1632(auVar16));
            auVar123 = vfnmadd213ps_fma(auVar57,auVar133,local_4c0);
            auVar139 = vfmadd213ps_fma(auVar61,ZEXT1632(auVar13),local_2e0);
            auVar153 = vfnmadd213ps_fma(auVar58,auVar133,local_560);
            auVar133 = ZEXT1632(auVar13);
            auVar122 = vfmadd213ps_fma(auVar62,auVar133,auVar149);
            auVar126 = ZEXT1632(auVar164);
            auVar121 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar126,auVar59);
            auVar16 = vfmadd213ps_fma(auVar63,auVar133,ZEXT1632(auVar14));
            auVar160 = vfnmadd213ps_fma(auVar61,auVar133,local_2e0);
            auVar101 = vfnmadd213ps_fma(auVar62,auVar133,auVar149);
            auVar159 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar63);
            auVar133 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar153));
            auVar201 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar121));
            auVar177._0_4_ = auVar133._0_4_ * auVar121._0_4_;
            auVar177._4_4_ = auVar133._4_4_ * auVar121._4_4_;
            auVar177._8_4_ = auVar133._8_4_ * auVar121._8_4_;
            auVar177._12_4_ = auVar133._12_4_ * auVar121._12_4_;
            auVar177._16_4_ = auVar133._16_4_ * 0.0;
            auVar177._20_4_ = auVar133._20_4_ * 0.0;
            auVar177._24_4_ = auVar133._24_4_ * 0.0;
            auVar177._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar177,ZEXT1632(auVar153),auVar201);
            auVar64._4_4_ = auVar123._4_4_ * auVar201._4_4_;
            auVar64._0_4_ = auVar123._0_4_ * auVar201._0_4_;
            auVar64._8_4_ = auVar123._8_4_ * auVar201._8_4_;
            auVar64._12_4_ = auVar123._12_4_ * auVar201._12_4_;
            auVar64._16_4_ = auVar201._16_4_ * 0.0;
            auVar64._20_4_ = auVar201._20_4_ * 0.0;
            auVar64._24_4_ = auVar201._24_4_ * 0.0;
            auVar64._28_4_ = auVar201._28_4_;
            auVar195 = ZEXT1632(auVar123);
            auVar201 = vsubps_avx(ZEXT1632(auVar139),auVar195);
            auVar106 = ZEXT1632(auVar121);
            auVar14 = vfmsub231ps_fma(auVar64,auVar106,auVar201);
            auVar65._4_4_ = auVar153._4_4_ * auVar201._4_4_;
            auVar65._0_4_ = auVar153._0_4_ * auVar201._0_4_;
            auVar65._8_4_ = auVar153._8_4_ * auVar201._8_4_;
            auVar65._12_4_ = auVar153._12_4_ * auVar201._12_4_;
            auVar65._16_4_ = auVar201._16_4_ * 0.0;
            auVar65._20_4_ = auVar201._20_4_ * 0.0;
            auVar65._24_4_ = auVar201._24_4_ * 0.0;
            auVar65._28_4_ = auVar201._28_4_;
            auVar123 = vfmsub231ps_fma(auVar65,auVar195,auVar133);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
            auVar20 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar133 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar17),auVar20);
            auVar201 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar104),auVar20);
            auVar112 = vblendvps_avx(ZEXT1632(auVar159),ZEXT1632(auVar103),auVar20);
            auVar150 = vblendvps_avx(auVar195,ZEXT1632(auVar139),auVar20);
            auVar210 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar122),auVar20);
            auVar7 = vblendvps_avx(auVar106,ZEXT1632(auVar16),auVar20);
            auVar195 = vblendvps_avx(ZEXT1632(auVar139),auVar195,auVar20);
            auVar186 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar153),auVar20);
            auVar14 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
            auVar106 = vblendvps_avx(ZEXT1632(auVar16),auVar106,auVar20);
            auVar195 = vsubps_avx(auVar195,auVar133);
            auVar186 = vsubps_avx(auVar186,auVar201);
            auVar149 = vsubps_avx(auVar106,auVar112);
            auVar18 = vsubps_avx(auVar133,auVar150);
            auVar19 = vsubps_avx(auVar201,auVar210);
            auVar107 = vsubps_avx(auVar112,auVar7);
            auVar172._0_4_ = auVar149._0_4_ * auVar133._0_4_;
            auVar172._4_4_ = auVar149._4_4_ * auVar133._4_4_;
            auVar172._8_4_ = auVar149._8_4_ * auVar133._8_4_;
            auVar172._12_4_ = auVar149._12_4_ * auVar133._12_4_;
            auVar172._16_4_ = auVar149._16_4_ * auVar133._16_4_;
            auVar172._20_4_ = auVar149._20_4_ * auVar133._20_4_;
            auVar172._24_4_ = auVar149._24_4_ * auVar133._24_4_;
            auVar172._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar172,auVar112,auVar195);
            auVar66._4_4_ = auVar195._4_4_ * auVar201._4_4_;
            auVar66._0_4_ = auVar195._0_4_ * auVar201._0_4_;
            auVar66._8_4_ = auVar195._8_4_ * auVar201._8_4_;
            auVar66._12_4_ = auVar195._12_4_ * auVar201._12_4_;
            auVar66._16_4_ = auVar195._16_4_ * auVar201._16_4_;
            auVar66._20_4_ = auVar195._20_4_ * auVar201._20_4_;
            auVar66._24_4_ = auVar195._24_4_ * auVar201._24_4_;
            auVar66._28_4_ = auVar106._28_4_;
            auVar17 = vfmsub231ps_fma(auVar66,auVar133,auVar186);
            auVar209 = ZEXT864(0) << 0x20;
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar173._0_4_ = auVar186._0_4_ * auVar112._0_4_;
            auVar173._4_4_ = auVar186._4_4_ * auVar112._4_4_;
            auVar173._8_4_ = auVar186._8_4_ * auVar112._8_4_;
            auVar173._12_4_ = auVar186._12_4_ * auVar112._12_4_;
            auVar173._16_4_ = auVar186._16_4_ * auVar112._16_4_;
            auVar173._20_4_ = auVar186._20_4_ * auVar112._20_4_;
            auVar173._24_4_ = auVar186._24_4_ * auVar112._24_4_;
            auVar173._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar173,auVar201,auVar149);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar174._0_4_ = auVar107._0_4_ * auVar150._0_4_;
            auVar174._4_4_ = auVar107._4_4_ * auVar150._4_4_;
            auVar174._8_4_ = auVar107._8_4_ * auVar150._8_4_;
            auVar174._12_4_ = auVar107._12_4_ * auVar150._12_4_;
            auVar174._16_4_ = auVar107._16_4_ * auVar150._16_4_;
            auVar174._20_4_ = auVar107._20_4_ * auVar150._20_4_;
            auVar174._24_4_ = auVar107._24_4_ * auVar150._24_4_;
            auVar174._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar174,auVar18,auVar7);
            auVar67._4_4_ = auVar19._4_4_ * auVar7._4_4_;
            auVar67._0_4_ = auVar19._0_4_ * auVar7._0_4_;
            auVar67._8_4_ = auVar19._8_4_ * auVar7._8_4_;
            auVar67._12_4_ = auVar19._12_4_ * auVar7._12_4_;
            auVar67._16_4_ = auVar19._16_4_ * auVar7._16_4_;
            auVar67._20_4_ = auVar19._20_4_ * auVar7._20_4_;
            auVar67._24_4_ = auVar19._24_4_ * auVar7._24_4_;
            auVar67._28_4_ = auVar7._28_4_;
            auVar104 = vfmsub231ps_fma(auVar67,auVar210,auVar107);
            auVar68._4_4_ = auVar18._4_4_ * auVar210._4_4_;
            auVar68._0_4_ = auVar18._0_4_ * auVar210._0_4_;
            auVar68._8_4_ = auVar18._8_4_ * auVar210._8_4_;
            auVar68._12_4_ = auVar18._12_4_ * auVar210._12_4_;
            auVar68._16_4_ = auVar18._16_4_ * auVar210._16_4_;
            auVar68._20_4_ = auVar18._20_4_ * auVar210._20_4_;
            auVar68._24_4_ = auVar18._24_4_ * auVar210._24_4_;
            auVar68._28_4_ = auVar210._28_4_;
            auVar103 = vfmsub231ps_fma(auVar68,auVar19,auVar150);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar104));
            auVar150 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar104));
            auVar150 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
            auVar16 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
            auVar16 = vpand_avx(auVar16,auVar14);
            auVar150 = vpmovsxwd_avx2(auVar16);
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0x7f,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0xbf,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar150[0x1f]) {
              auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                            CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
              auVar196 = ZEXT3264(auVar191);
            }
            else {
              auVar69._4_4_ = auVar186._4_4_ * auVar107._4_4_;
              auVar69._0_4_ = auVar186._0_4_ * auVar107._0_4_;
              auVar69._8_4_ = auVar186._8_4_ * auVar107._8_4_;
              auVar69._12_4_ = auVar186._12_4_ * auVar107._12_4_;
              auVar69._16_4_ = auVar186._16_4_ * auVar107._16_4_;
              auVar69._20_4_ = auVar186._20_4_ * auVar107._20_4_;
              auVar69._24_4_ = auVar186._24_4_ * auVar107._24_4_;
              auVar69._28_4_ = auVar150._28_4_;
              auVar102 = vfmsub231ps_fma(auVar69,auVar19,auVar149);
              auVar178._0_4_ = auVar18._0_4_ * auVar149._0_4_;
              auVar178._4_4_ = auVar18._4_4_ * auVar149._4_4_;
              auVar178._8_4_ = auVar18._8_4_ * auVar149._8_4_;
              auVar178._12_4_ = auVar18._12_4_ * auVar149._12_4_;
              auVar178._16_4_ = auVar18._16_4_ * auVar149._16_4_;
              auVar178._20_4_ = auVar18._20_4_ * auVar149._20_4_;
              auVar178._24_4_ = auVar18._24_4_ * auVar149._24_4_;
              auVar178._28_4_ = 0;
              auVar122 = vfmsub231ps_fma(auVar178,auVar195,auVar107);
              auVar70._4_4_ = auVar195._4_4_ * auVar19._4_4_;
              auVar70._0_4_ = auVar195._0_4_ * auVar19._0_4_;
              auVar70._8_4_ = auVar195._8_4_ * auVar19._8_4_;
              auVar70._12_4_ = auVar195._12_4_ * auVar19._12_4_;
              auVar70._16_4_ = auVar195._16_4_ * auVar19._16_4_;
              auVar70._20_4_ = auVar195._20_4_ * auVar19._20_4_;
              auVar70._24_4_ = auVar195._24_4_ * auVar19._24_4_;
              auVar70._28_4_ = auVar19._28_4_;
              auVar123 = vfmsub231ps_fma(auVar70,auVar18,auVar186);
              auVar103 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar122),ZEXT1632(auVar123));
              auVar139 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar102),ZEXT832(0) << 0x20);
              auVar150 = vrcpps_avx(ZEXT1632(auVar139));
              auVar207._8_4_ = 0x3f800000;
              auVar207._0_8_ = 0x3f8000003f800000;
              auVar207._12_4_ = 0x3f800000;
              auVar207._16_4_ = 0x3f800000;
              auVar207._20_4_ = 0x3f800000;
              auVar207._24_4_ = 0x3f800000;
              auVar207._28_4_ = 0x3f800000;
              auVar209 = ZEXT3264(auVar207);
              auVar103 = vfnmadd213ps_fma(auVar150,ZEXT1632(auVar139),auVar207);
              auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar150,auVar150);
              auVar71._4_4_ = auVar123._4_4_ * auVar112._4_4_;
              auVar71._0_4_ = auVar123._0_4_ * auVar112._0_4_;
              auVar71._8_4_ = auVar123._8_4_ * auVar112._8_4_;
              auVar71._12_4_ = auVar123._12_4_ * auVar112._12_4_;
              auVar71._16_4_ = auVar112._16_4_ * 0.0;
              auVar71._20_4_ = auVar112._20_4_ * 0.0;
              auVar71._24_4_ = auVar112._24_4_ * 0.0;
              auVar71._28_4_ = auVar112._28_4_;
              auVar122 = vfmadd231ps_fma(auVar71,ZEXT1632(auVar122),auVar201);
              auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),ZEXT1632(auVar102),auVar133);
              fVar138 = auVar103._0_4_;
              fVar137 = auVar103._4_4_;
              fVar113 = auVar103._8_4_;
              fVar114 = auVar103._12_4_;
              auVar112 = ZEXT1632(CONCAT412(fVar114 * auVar122._12_4_,
                                            CONCAT48(fVar113 * auVar122._8_4_,
                                                     CONCAT44(fVar137 * auVar122._4_4_,
                                                              fVar138 * auVar122._0_4_))));
              uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar156._4_4_ = uVar99;
              auVar156._0_4_ = uVar99;
              auVar156._8_4_ = uVar99;
              auVar156._12_4_ = uVar99;
              auVar156._16_4_ = uVar99;
              auVar156._20_4_ = uVar99;
              auVar156._24_4_ = uVar99;
              auVar156._28_4_ = uVar99;
              auVar88._4_4_ = uStack_4fc;
              auVar88._0_4_ = local_500;
              auVar88._8_4_ = uStack_4f8;
              auVar88._12_4_ = uStack_4f4;
              auVar88._16_4_ = uStack_4f0;
              auVar88._20_4_ = uStack_4ec;
              auVar88._24_4_ = uStack_4e8;
              auVar88._28_4_ = uStack_4e4;
              auVar133 = vcmpps_avx(auVar88,auVar112,2);
              auVar201 = vcmpps_avx(auVar112,auVar156,2);
              auVar133 = vandps_avx(auVar201,auVar133);
              auVar103 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
              auVar16 = vpand_avx(auVar16,auVar103);
              auVar133 = vpmovsxwd_avx2(auVar16);
              if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar133 >> 0x7f,0) == '\0') &&
                    (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar133 >> 0xbf,0) == '\0') &&
                  (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar133[0x1f]) {
                auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                              CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))))
                ;
                auVar196 = ZEXT3264(auVar191);
              }
              else {
                auVar133 = vcmpps_avx(ZEXT1632(auVar139),ZEXT832(0) << 0x20,4);
                auVar103 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
                auVar16 = vpand_avx(auVar16,auVar103);
                auVar133 = vpmovsxwd_avx2(auVar16);
                auVar179 = ZEXT3264(CONCAT824(uStack_508,
                                              CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))))
                ;
                auVar196 = ZEXT3264(auVar191);
                if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar133 >> 0x7f,0) != '\0') ||
                      (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar133 >> 0xbf,0) != '\0') ||
                    (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar133[0x1f] < '\0') {
                  auVar150 = ZEXT1632(CONCAT412(fVar114 * auVar17._12_4_,
                                                CONCAT48(fVar113 * auVar17._8_4_,
                                                         CONCAT44(fVar137 * auVar17._4_4_,
                                                                  fVar138 * auVar17._0_4_))));
                  auVar72._28_4_ = SUB84(uStack_508,4);
                  auVar72._0_28_ =
                       ZEXT1628(CONCAT412(fVar114 * auVar104._12_4_,
                                          CONCAT48(fVar113 * auVar104._8_4_,
                                                   CONCAT44(fVar137 * auVar104._4_4_,
                                                            fVar138 * auVar104._0_4_))));
                  auVar187._8_4_ = 0x3f800000;
                  auVar187._0_8_ = 0x3f8000003f800000;
                  auVar187._12_4_ = 0x3f800000;
                  auVar187._16_4_ = 0x3f800000;
                  auVar187._20_4_ = 0x3f800000;
                  auVar187._24_4_ = 0x3f800000;
                  auVar187._28_4_ = 0x3f800000;
                  auVar201 = vsubps_avx(auVar187,auVar150);
                  local_5a0 = vblendvps_avx(auVar201,auVar150,auVar20);
                  auVar201 = vsubps_avx(auVar187,auVar72);
                  local_3a0 = vblendvps_avx(auVar201,auVar72,auVar20);
                  auVar179 = ZEXT3264(auVar133);
                  auVar196 = ZEXT3264(auVar112);
                }
              }
            }
            auVar204 = ZEXT3264(local_720);
            uVar93 = uVar93 & 0xffffffff;
            auVar133 = auVar179._0_32_;
            if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar133 >> 0x7f,0) == '\0') &&
                  (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar133 >> 0xbf,0) == '\0') &&
                (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar179[0x1f]) {
              auVar135 = ZEXT3264(local_5a0);
              auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                            CONCAT424(fStack_688,
                                                      CONCAT420(fStack_68c,
                                                                CONCAT416(fStack_690,
                                                                          CONCAT412(fStack_694,
                                                                                    CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
              auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,CONCAT416(
                                                  fVar152,CONCAT412(fVar158,CONCAT48(fVar152,uVar100
                                                                                    )))))));
              auVar188 = ZEXT3264(local_6c0);
            }
            else {
              auVar201 = vsubps_avx(ZEXT1632(auVar13),auVar126);
              auVar13 = vfmadd213ps_fma(auVar201,local_5a0,auVar126);
              fVar138 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar73._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar138;
              auVar73._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar138;
              auVar73._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar138;
              auVar73._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar138;
              auVar73._16_4_ = fVar138 * 0.0;
              auVar73._20_4_ = fVar138 * 0.0;
              auVar73._24_4_ = fVar138 * 0.0;
              auVar73._28_4_ = fVar138;
              auVar150 = auVar196._0_32_;
              auVar201 = vcmpps_avx(auVar150,auVar73,6);
              auVar112 = auVar133 & auVar201;
              auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                            CONCAT424(fStack_688,
                                                      CONCAT420(fStack_68c,
                                                                CONCAT416(fStack_690,
                                                                          CONCAT412(fStack_694,
                                                                                    CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
              auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,CONCAT416(
                                                  fVar152,CONCAT412(fVar158,CONCAT48(fVar152,uVar100
                                                                                    )))))));
              auVar188 = ZEXT3264(local_6c0);
              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar112 >> 0x7f,0) == '\0') &&
                    (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar112 >> 0xbf,0) == '\0') &&
                  (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar112[0x1f]) {
                auVar135 = ZEXT3264(local_5a0);
              }
              else {
                auVar134._8_4_ = 0xbf800000;
                auVar134._0_8_ = 0xbf800000bf800000;
                auVar134._12_4_ = 0xbf800000;
                auVar134._16_4_ = 0xbf800000;
                auVar134._20_4_ = 0xbf800000;
                auVar134._24_4_ = 0xbf800000;
                auVar134._28_4_ = 0xbf800000;
                auVar151._8_4_ = 0x40000000;
                auVar151._0_8_ = 0x4000000040000000;
                auVar151._12_4_ = 0x40000000;
                auVar151._16_4_ = 0x40000000;
                auVar151._20_4_ = 0x40000000;
                auVar151._24_4_ = 0x40000000;
                auVar151._28_4_ = 0x40000000;
                auVar13 = vfmadd213ps_fma(local_3a0,auVar151,auVar134);
                local_260 = local_5a0;
                local_240 = ZEXT1632(auVar13);
                local_1f0 = local_680;
                uStack_1e8 = uStack_678;
                local_1e0 = local_660._0_8_;
                uStack_1d8 = local_660._8_8_;
                local_1d0 = local_670._0_8_;
                uStack_1c8 = local_670._8_8_;
                pGVar10 = (context->scene->geometries).items[local_728].ptr;
                auVar135 = ZEXT3264(local_5a0);
                local_3a0 = local_240;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar91 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar91 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar133 = vandps_avx(auVar201,auVar133);
                  fVar138 = (float)local_200;
                  local_180[0] = (fVar138 + local_5a0._0_4_ + 0.0) * local_120;
                  local_180[1] = (fVar138 + local_5a0._4_4_ + 1.0) * fStack_11c;
                  local_180[2] = (fVar138 + local_5a0._8_4_ + 2.0) * fStack_118;
                  local_180[3] = (fVar138 + local_5a0._12_4_ + 3.0) * fStack_114;
                  fStack_170 = (fVar138 + local_5a0._16_4_ + 4.0) * fStack_110;
                  fStack_16c = (fVar138 + local_5a0._20_4_ + 5.0) * fStack_10c;
                  fStack_168 = (fVar138 + local_5a0._24_4_ + 6.0) * fStack_108;
                  fStack_164 = fVar138 + local_5a0._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar13._0_8_;
                  local_3a0._8_8_ = auVar13._8_8_;
                  local_160 = local_3a0._0_8_;
                  uStack_158 = local_3a0._8_8_;
                  uStack_150 = 0;
                  uStack_148 = 0;
                  local_140 = auVar150;
                  uVar94 = vmovmskps_avx(auVar133);
                  if (uVar94 == 0) {
                    bVar91 = 0;
LAB_015c832a:
                    auVar204 = ZEXT3264(local_720);
                    auVar135 = ZEXT3264(local_5a0);
                    auVar196 = ZEXT3264(auVar150);
                    auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                                  CONCAT424(fStack_688,
                                                            CONCAT420(fStack_68c,
                                                                      CONCAT416(fStack_690,
                                                                                CONCAT412(fStack_694
                                                                                          ,CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                    auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                    auVar188 = ZEXT3264(local_6c0);
                  }
                  else {
                    uVar93 = (ulong)(uVar94 & 0xff);
                    _local_700 = ZEXT1632(CONCAT88(auVar164._8_8_,uVar93));
                    lVar22 = 0;
                    for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
                      lVar22 = lVar22 + 1;
                    }
                    local_840 = ZEXT1632(CONCAT88(auVar14._8_8_,lVar22));
                    local_560 = ZEXT1632(*(undefined1 (*) [16])
                                          (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10))
                    ;
                    local_5c0 = ZEXT1632(CONCAT124(auVar15._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x80)));
                    _local_320 = *pauVar3;
                    _local_300 = *pauVar2;
                    local_220 = auVar150;
                    local_1fc = iVar9;
                    do {
                      fVar138 = local_180[local_840._0_8_];
                      local_400._4_4_ = fVar138;
                      local_400._0_4_ = fVar138;
                      local_400._8_4_ = fVar138;
                      local_400._12_4_ = fVar138;
                      local_3f0 = *(undefined4 *)((long)&local_160 + local_840._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_140 + local_840._0_8_ * 4);
                      fVar113 = 1.0 - fVar138;
                      auVar164 = ZEXT416((uint)(fVar138 * fVar113 * 4.0));
                      auVar13 = vfnmsub213ss_fma(local_400,local_400,auVar164);
                      auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),
                                                 auVar164);
                      fVar137 = auVar164._0_4_ * 0.5;
                      fVar138 = fVar138 * fVar138 * 0.5;
                      auVar165._0_4_ = fVar138 * (float)local_530._0_4_;
                      auVar165._4_4_ = fVar138 * (float)local_530._4_4_;
                      auVar165._8_4_ = fVar138 * fStack_528;
                      auVar165._12_4_ = fVar138 * fStack_524;
                      auVar143._4_4_ = fVar137;
                      auVar143._0_4_ = fVar137;
                      auVar143._8_4_ = fVar137;
                      auVar143._12_4_ = fVar137;
                      auVar164 = vfmadd132ps_fma(auVar143,auVar165,local_670);
                      fVar138 = auVar13._0_4_ * 0.5;
                      auVar166._4_4_ = fVar138;
                      auVar166._0_4_ = fVar138;
                      auVar166._8_4_ = fVar138;
                      auVar166._12_4_ = fVar138;
                      auVar164 = vfmadd132ps_fma(auVar166,auVar164,local_660);
                      local_650.context = context->user;
                      fVar138 = fVar113 * -fVar113 * 0.5;
                      auVar144._4_4_ = fVar138;
                      auVar144._0_4_ = fVar138;
                      auVar144._8_4_ = fVar138;
                      auVar144._12_4_ = fVar138;
                      auVar87._8_8_ = uStack_678;
                      auVar87._0_8_ = local_680;
                      auVar164 = vfmadd132ps_fma(auVar144,auVar164,auVar87);
                      local_430 = auVar164._0_4_;
                      local_420 = vshufps_avx(auVar164,auVar164,0x55);
                      local_410 = vshufps_avx(auVar164,auVar164,0xaa);
                      local_3e0 = CONCAT44(uStack_56c,local_570);
                      uStack_3d8 = CONCAT44(uStack_564,uStack_568);
                      local_3d0._4_4_ = uStack_28c;
                      local_3d0._0_4_ = local_290;
                      local_3d0._8_4_ = uStack_288;
                      local_3d0._12_4_ = uStack_284;
                      vpcmpeqd_avx2(ZEXT1632(local_3d0),ZEXT1632(local_3d0));
                      uStack_3bc = (local_650.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_650.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_740 = local_560._0_16_;
                      local_650.valid = (int *)local_740;
                      local_650.geometryUserPtr = pGVar10->userPtr;
                      local_650.hit = (RTCHitN *)&local_430;
                      local_650.N = 4;
                      local_650.ray = (RTCRayN *)ray;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (*pGVar10->occlusionFilterN)(&local_650);
                      }
                      if (local_740 == (undefined1  [16])0x0) {
                        auVar164 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar164 = auVar164 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          (*p_Var12)(&local_650);
                        }
                        auVar13 = vpcmpeqd_avx(local_740,_DAT_01f7aa10);
                        auVar164 = auVar13 ^ _DAT_01f7ae20;
                        auVar145._8_4_ = 0xff800000;
                        auVar145._0_8_ = 0xff800000ff800000;
                        auVar145._12_4_ = 0xff800000;
                        auVar13 = vblendvps_avx(auVar145,*(undefined1 (*) [16])
                                                          (local_650.ray + 0x80),auVar13);
                        *(undefined1 (*) [16])(local_650.ray + 0x80) = auVar13;
                      }
                      auVar125._8_8_ = 0x100000001;
                      auVar125._0_8_ = 0x100000001;
                      if ((auVar125 & auVar164) != (undefined1  [16])0x0) {
                        bVar91 = 1;
                        goto LAB_015c832a;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
                      uVar96 = (ulong)local_700 ^ 1L << (local_840._0_8_ & 0x3f);
                      bVar91 = 0;
                      local_700 = (undefined1  [8])uVar96;
                      lVar22 = 0;
                      for (uVar93 = uVar96; (uVar93 & 1) == 0;
                          uVar93 = uVar93 >> 1 | 0x8000000000000000) {
                        lVar22 = lVar22 + 1;
                      }
                      local_840._0_8_ = lVar22;
                      auVar204 = ZEXT3264(local_720);
                      auVar135 = ZEXT3264(local_5a0);
                      auVar196 = ZEXT3264(auVar150);
                      auVar183 = ZEXT3264(CONCAT428(fStack_684,
                                                    CONCAT424(fStack_688,
                                                              CONCAT420(fStack_68c,
                                                                        CONCAT416(fStack_690,
                                                                                  CONCAT412(
                                                  fStack_694,
                                                  CONCAT48(fStack_698,CONCAT44(fStack_69c,local_6a0)
                                                          )))))));
                      auVar179 = ZEXT3264(CONCAT428(fVar158,CONCAT424(fVar152,CONCAT420(fVar158,
                                                  CONCAT416(fVar152,CONCAT412(fVar158,CONCAT48(
                                                  fVar152,uVar100)))))));
                      auVar188 = ZEXT3264(local_6c0);
                    } while (uVar96 != 0);
                  }
                }
                uVar93 = (ulong)CONCAT31(local_600._1_3_,local_600[0] | bVar91);
              }
            }
          }
          local_5a0 = auVar135._0_32_;
          uVar94 = (uint)uVar93;
          lVar98 = lVar98 + 8;
          auVar157 = ZEXT3264(local_6e0);
        } while ((int)lVar98 < iVar9);
      }
      bVar91 = (byte)uVar94;
      if ((uVar94 & 1) != 0) break;
      uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar105._4_4_ = uVar99;
      auVar105._0_4_ = uVar99;
      auVar105._8_4_ = uVar99;
      auVar105._12_4_ = uVar99;
      auVar164 = vcmpps_avx(local_280,auVar105,2);
      uVar94 = vmovmskps_avx(auVar164);
      uVar94 = (uint)uVar97 & uVar94;
    } while (uVar94 != 0);
  }
  return (bool)(bVar91 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }